

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred_ssse3.c
# Opt level: O0

void aom_smooth_h_predictor_64x32_ssse3
               (uint8_t *dst,ptrdiff_t stride,uint8_t *top_row,uint8_t *left_column)

{
  undefined8 uVar1;
  byte bVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  ushort uVar10;
  undefined8 *in_RCX;
  long in_RDX;
  long in_RSI;
  undefined8 *in_RDI;
  short sVar11;
  short sVar12;
  short sVar13;
  short sVar14;
  ushort uVar15;
  ushort uVar16;
  ushort uVar17;
  ushort uVar18;
  short sVar20;
  short sVar21;
  short sVar22;
  short sVar23;
  ushort uVar24;
  ushort uVar25;
  ushort uVar26;
  ushort uVar27;
  short sVar28;
  short sVar29;
  short sVar30;
  short sVar31;
  ushort uVar32;
  ushort uVar33;
  ushort uVar34;
  ushort uVar35;
  short sVar36;
  short sVar37;
  short sVar38;
  short sVar39;
  ushort uVar40;
  ushort uVar41;
  ushort uVar42;
  ushort uVar43;
  short sVar44;
  short sVar45;
  short sVar46;
  short sVar47;
  ushort uVar48;
  ushort uVar49;
  ushort uVar50;
  ushort uVar51;
  short sVar52;
  short sVar53;
  short sVar54;
  short sVar55;
  ushort uVar56;
  ushort uVar57;
  ushort uVar58;
  ushort uVar59;
  short sVar60;
  short sVar61;
  short sVar62;
  short sVar63;
  ushort uVar64;
  ushort uVar65;
  ushort uVar66;
  ushort uVar67;
  short sVar68;
  short sVar69;
  short sVar70;
  short sVar71;
  undefined1 auVar19 [16];
  ushort uVar72;
  ushort uVar73;
  ushort uVar74;
  ushort uVar75;
  short sVar76;
  short sVar77;
  short sVar78;
  short sVar79;
  short sVar80;
  short sVar81;
  short sVar82;
  short sVar83;
  short sVar84;
  short sVar85;
  short sVar86;
  short sVar87;
  short sVar88;
  short sVar89;
  short sVar90;
  short sVar91;
  short sVar92;
  short sVar93;
  short sVar94;
  short sVar95;
  short sVar96;
  short sVar97;
  short sVar98;
  short sVar99;
  short sVar100;
  short sVar101;
  short sVar102;
  short sVar103;
  short sVar104;
  short sVar105;
  short sVar106;
  __m128i y_select_2;
  int y_mask_2;
  __m128i left3;
  __m128i left_y_1;
  __m128i y_select_1;
  int y_mask_1;
  __m128i left2;
  __m128i left_y;
  __m128i y_select;
  int y_mask;
  __m128i round;
  __m128i scaled_top_right8;
  __m128i scaled_top_right7;
  __m128i scaled_top_right6;
  __m128i scaled_top_right5;
  __m128i inverted_weights8;
  __m128i inverted_weights7;
  __m128i inverted_weights6;
  __m128i inverted_weights5;
  __m128i weights8;
  __m128i weights7;
  __m128i weights6;
  __m128i weights5;
  __m128i weights_hihi;
  __m128i weights_hilo;
  __m128i scaled_top_right4;
  __m128i scaled_top_right3;
  __m128i scaled_top_right2;
  __m128i scaled_top_right1;
  __m128i inverted_weights4;
  __m128i inverted_weights3;
  __m128i inverted_weights2;
  __m128i inverted_weights1;
  __m128i weights4;
  __m128i weights3;
  __m128i weights2;
  __m128i weights1;
  __m128i scale;
  __m128i weights_lohi;
  __m128i weights_lolo;
  __m128i left1;
  __m128i top_right;
  __m128i pred2_15;
  __m128i pred1_15;
  __m128i pred_sum2_15;
  __m128i pred_sum1_15;
  __m128i weighted_px2_15;
  __m128i weighted_px1_15;
  __m128i pred2_14;
  __m128i pred1_14;
  __m128i pred_sum2_14;
  __m128i pred_sum1_14;
  __m128i weighted_px2_14;
  __m128i weighted_px1_14;
  __m128i pred2_13;
  __m128i pred1_13;
  __m128i pred_sum2_13;
  __m128i pred_sum1_13;
  __m128i weighted_px2_13;
  __m128i weighted_px1_13;
  __m128i pred2_12;
  __m128i pred1_12;
  __m128i pred_sum2_12;
  __m128i pred_sum1_12;
  __m128i weighted_px2_12;
  __m128i weighted_px1_12;
  __m128i pred2_11;
  __m128i pred1_11;
  __m128i pred_sum2_11;
  __m128i pred_sum1_11;
  __m128i weighted_px2_11;
  __m128i weighted_px1_11;
  __m128i pred2_10;
  __m128i pred1_10;
  __m128i pred_sum2_10;
  __m128i pred_sum1_10;
  __m128i weighted_px2_10;
  __m128i weighted_px1_10;
  __m128i pred2_9;
  __m128i pred1_9;
  __m128i pred_sum2_9;
  __m128i pred_sum1_9;
  __m128i weighted_px2_9;
  __m128i weighted_px1_9;
  __m128i pred2_8;
  __m128i pred1_8;
  __m128i pred_sum2_8;
  __m128i pred_sum1_8;
  __m128i weighted_px2_8;
  __m128i weighted_px1_8;
  __m128i pred2_7;
  __m128i pred1_7;
  __m128i pred_sum2_7;
  __m128i pred_sum1_7;
  __m128i weighted_px2_7;
  __m128i weighted_px1_7;
  __m128i pred2_6;
  __m128i pred1_6;
  __m128i pred_sum2_6;
  __m128i pred_sum1_6;
  __m128i weighted_px2_6;
  __m128i weighted_px1_6;
  __m128i pred2_5;
  __m128i pred1_5;
  __m128i pred_sum2_5;
  __m128i pred_sum1_5;
  __m128i weighted_px2_5;
  __m128i weighted_px1_5;
  __m128i pred2_4;
  __m128i pred1_4;
  __m128i pred_sum2_4;
  __m128i pred_sum1_4;
  __m128i weighted_px2_4;
  __m128i weighted_px1_4;
  __m128i pred2_3;
  __m128i pred1_3;
  __m128i pred_sum2_3;
  __m128i pred_sum1_3;
  __m128i weighted_px2_3;
  __m128i weighted_px1_3;
  __m128i pred2_2;
  __m128i pred1_2;
  __m128i pred_sum2_2;
  __m128i pred_sum1_2;
  __m128i weighted_px2_2;
  __m128i weighted_px1_2;
  __m128i pred2_1;
  __m128i pred1_1;
  __m128i pred_sum2_1;
  __m128i pred_sum1_1;
  __m128i weighted_px2_1;
  __m128i weighted_px1_1;
  __m128i pred2;
  __m128i pred1;
  __m128i pred_sum2;
  __m128i pred_sum1;
  __m128i weighted_px2;
  __m128i weighted_px1;
  int local_2e2c;
  int local_2dec;
  int local_2dac;
  int local_2d6c;
  undefined8 *local_2b48;
  byte local_2a88;
  undefined1 uStack_2a87;
  undefined1 uStack_2a86;
  undefined1 uStack_2a85;
  byte bStack_2a84;
  undefined1 uStack_2a83;
  undefined1 uStack_2a82;
  undefined1 uStack_2a81;
  byte local_2a48;
  undefined1 uStack_2a47;
  undefined1 uStack_2a46;
  undefined1 uStack_2a45;
  byte bStack_2a44;
  undefined1 uStack_2a43;
  undefined1 uStack_2a42;
  undefined1 uStack_2a41;
  byte local_2a08;
  undefined1 uStack_2a07;
  undefined1 uStack_2a06;
  undefined1 uStack_2a05;
  byte bStack_2a04;
  undefined1 uStack_2a03;
  undefined1 uStack_2a02;
  undefined1 uStack_2a01;
  byte local_27c8;
  undefined1 uStack_27c7;
  undefined1 uStack_27c6;
  undefined1 uStack_27c5;
  byte bStack_27c4;
  undefined1 uStack_27c3;
  undefined1 uStack_27c2;
  undefined1 uStack_27c1;
  ushort uStack_26b2;
  ushort uStack_26aa;
  ushort uStack_2692;
  ushort uStack_268a;
  ushort uStack_2672;
  ushort uStack_266a;
  ushort uStack_2652;
  ushort uStack_264a;
  ushort uStack_2632;
  ushort uStack_262a;
  ushort uStack_2612;
  ushort uStack_260a;
  ushort uStack_25f2;
  ushort uStack_25ea;
  ushort uStack_25d6;
  ushort uStack_25d4;
  ushort uStack_25d2;
  ushort uStack_25ce;
  ushort uStack_25cc;
  ushort uStack_25ca;
  short local_1e08;
  short sStack_1e06;
  short sStack_1e04;
  short sStack_1e02;
  short sStack_1e00;
  short sStack_1dfe;
  short sStack_1dfc;
  short sStack_1dfa;
  short local_1708;
  short sStack_1706;
  short sStack_1704;
  short sStack_1702;
  short sStack_1700;
  short sStack_16fe;
  short sStack_16fc;
  short sStack_16fa;
  short local_1008;
  short sStack_1006;
  short sStack_1004;
  short sStack_1002;
  short sStack_1000;
  short sStack_ffe;
  short sStack_ffc;
  short sStack_ffa;
  short local_908;
  short sStack_906;
  short sStack_904;
  short sStack_902;
  short sStack_900;
  short sStack_8fe;
  short sStack_8fc;
  short sStack_8fa;
  __m128i left_y_3;
  __m128i y_select_3;
  int y_mask_3;
  __m128i left4;
  __m128i left_y_2;
  
  bVar2 = *(byte *)(in_RDX + 0x3f);
  uVar10 = (ushort)bVar2;
  uVar1 = *in_RCX;
  local_27c8 = (byte)uVar1;
  uStack_27c7 = (undefined1)((ulong)uVar1 >> 8);
  uStack_27c6 = (undefined1)((ulong)uVar1 >> 0x10);
  uStack_27c5 = (undefined1)((ulong)uVar1 >> 0x18);
  bStack_27c4 = (byte)((ulong)uVar1 >> 0x20);
  uStack_27c3 = (undefined1)((ulong)uVar1 >> 0x28);
  uStack_27c2 = (undefined1)((ulong)uVar1 >> 0x30);
  uStack_27c1 = (undefined1)((ulong)uVar1 >> 0x38);
  uStack_25d6 = (ushort)bVar2;
  uStack_25d4 = (ushort)bVar2;
  uStack_25d2 = (ushort)bVar2;
  uStack_25ce = (ushort)bVar2;
  uStack_25cc = (ushort)bVar2;
  uStack_25ca = (ushort)bVar2;
  sVar79 = uStack_25d6 * 8;
  sVar83 = uStack_25d4 * 0x10;
  sVar87 = uStack_25d2 * 0x17;
  sVar91 = uVar10 * 0x1f;
  sVar95 = uStack_25ce * 0x26;
  sVar99 = uStack_25cc * 0x2e;
  sVar103 = uStack_25ca * 0x35;
  uStack_25f2 = (ushort)bVar2;
  uStack_25ea = (ushort)bVar2;
  sVar76 = uVar10 * 0x3c;
  sVar80 = uStack_25d6 * 0x43;
  sVar84 = uStack_25d4 * 0x4a;
  sVar88 = uStack_25f2 * 0x50;
  sVar92 = uVar10 * 0x57;
  sVar96 = uStack_25ce * 0x5d;
  sVar100 = uStack_25cc * 100;
  sVar104 = uStack_25ea * 0x6a;
  uStack_2612 = (ushort)bVar2;
  uStack_260a = (ushort)bVar2;
  sVar77 = uVar10 * 0x70;
  sVar81 = uStack_25d6 * 0x76;
  sVar85 = uStack_25d4 * 0x7b;
  sVar89 = uStack_2612 * 0x81;
  sVar93 = uVar10 * 0x87;
  sVar97 = uStack_25ce * 0x8c;
  sVar101 = uStack_25cc * 0x91;
  sVar105 = uStack_260a * 0x96;
  uStack_2632 = (ushort)bVar2;
  uStack_262a = (ushort)bVar2;
  sVar78 = uVar10 * 0x9b;
  sVar82 = uStack_25d6 * 0xa0;
  sVar86 = uStack_25d4 * 0xa5;
  sVar90 = uStack_2632 * 0xaa;
  sVar94 = uVar10 * 0xae;
  sVar98 = uStack_25ce * 0xb3;
  sVar102 = uStack_25cc * 0xb7;
  sVar106 = uStack_262a * 0xbb;
  uStack_2652 = (ushort)bVar2;
  uStack_264a = (ushort)bVar2;
  sVar11 = uVar10 * 0xbf;
  sVar20 = uStack_25d6 * 0xc3;
  sVar28 = uStack_25d4 * 199;
  sVar36 = uStack_2652 * 0xca;
  sVar44 = uVar10 * 0xce;
  sVar52 = uStack_25ce * 0xd1;
  sVar60 = uStack_25cc * 0xd4;
  sVar68 = uStack_264a * 0xd7;
  uStack_2672 = (ushort)bVar2;
  uStack_266a = (ushort)bVar2;
  sVar12 = uVar10 * 0xda;
  sVar21 = uStack_25d6 * 0xdd;
  sVar29 = uStack_25d4 * 0xe0;
  sVar37 = uStack_2672 * 0xe3;
  sVar45 = uVar10 * 0xe5;
  sVar53 = uStack_25ce * 0xe7;
  sVar61 = uStack_25cc * 0xea;
  sVar69 = uStack_266a * 0xec;
  uStack_2692 = (ushort)bVar2;
  uStack_268a = (ushort)bVar2;
  sVar13 = uVar10 * 0xee;
  sVar22 = uStack_25d6 * 0xf0;
  sVar30 = uStack_25d4 * 0xf1;
  sVar38 = uStack_2692 * 0xf3;
  sVar46 = uVar10 * 0xf4;
  sVar54 = uStack_25ce * 0xf6;
  sVar62 = uStack_25cc * 0xf7;
  sVar70 = uStack_268a * 0xf8;
  uStack_26b2 = (ushort)bVar2;
  uStack_26aa = (ushort)bVar2;
  sVar14 = uVar10 * 0xf9;
  sVar23 = uStack_25d6 * 0xfa;
  sVar31 = uStack_25d4 * 0xfa;
  sVar39 = uStack_26b2 * 0xfb;
  sVar47 = uVar10 * 0xfb;
  sVar55 = uStack_25ce * 0xfc;
  sVar63 = uStack_25cc * 0xfc;
  sVar71 = uStack_26aa * 0xfc;
  local_2b48 = in_RDI;
  for (local_2d6c = 0x1000100; local_2d6c < 0xf0e0f0f; local_2d6c = local_2d6c + 0x2020202) {
    auVar8._4_4_ = local_2d6c;
    auVar8._0_4_ = local_2d6c;
    auVar8._12_4_ = local_2d6c;
    auVar8._8_4_ = local_2d6c;
    auVar9[1] = 0;
    auVar9[0] = local_27c8;
    auVar9[2] = uStack_27c7;
    auVar9[3] = 0;
    auVar9[4] = uStack_27c6;
    auVar9[5] = 0;
    auVar9[6] = uStack_27c5;
    auVar9[7] = 0;
    auVar9[9] = 0;
    auVar9[8] = bStack_27c4;
    auVar9[10] = uStack_27c3;
    auVar9[0xb] = 0;
    auVar9[0xc] = uStack_27c2;
    auVar9[0xd] = 0;
    auVar9[0xe] = uStack_27c1;
    auVar9[0xf] = 0;
    auVar19 = pshufb(auVar9,auVar8);
    local_908 = auVar19._0_2_;
    sStack_906 = auVar19._2_2_;
    sStack_904 = auVar19._4_2_;
    sStack_902 = auVar19._6_2_;
    sStack_900 = auVar19._8_2_;
    sStack_8fe = auVar19._10_2_;
    sStack_8fc = auVar19._12_2_;
    sStack_8fa = auVar19._14_2_;
    uVar15 = uVar10 + local_908 * 0xff + 0x80;
    uVar24 = sVar79 + sStack_906 * 0xf8 + 0x80;
    uVar32 = sVar83 + sStack_904 * 0xf0 + 0x80;
    uVar40 = sVar87 + sStack_902 * 0xe9 + 0x80;
    uVar48 = sVar91 + sStack_900 * 0xe1 + 0x80;
    uVar56 = sVar95 + sStack_8fe * 0xda + 0x80;
    uVar64 = sVar99 + sStack_8fc * 0xd2 + 0x80;
    uVar72 = sVar103 + sStack_8fa * 0xcb + 0x80;
    uVar16 = uVar15 >> 8;
    uVar25 = uVar24 >> 8;
    uVar33 = uVar32 >> 8;
    uVar41 = uVar40 >> 8;
    uVar49 = uVar48 >> 8;
    uVar57 = uVar56 >> 8;
    uVar65 = uVar64 >> 8;
    uVar73 = uVar72 >> 8;
    uVar17 = sVar76 + local_908 * 0xc4 + 0x80;
    uVar26 = sVar80 + sStack_906 * 0xbd + 0x80;
    uVar34 = sVar84 + sStack_904 * 0xb6 + 0x80;
    uVar42 = sVar88 + sStack_902 * 0xb0 + 0x80;
    uVar50 = sVar92 + sStack_900 * 0xa9 + 0x80;
    uVar58 = sVar96 + sStack_8fe * 0xa3 + 0x80;
    uVar66 = sVar100 + sStack_8fc * 0x9c + 0x80;
    uVar74 = sVar104 + sStack_8fa * 0x96 + 0x80;
    uVar18 = uVar17 >> 8;
    uVar27 = uVar26 >> 8;
    uVar35 = uVar34 >> 8;
    uVar43 = uVar42 >> 8;
    uVar51 = uVar50 >> 8;
    uVar59 = uVar58 >> 8;
    uVar67 = uVar66 >> 8;
    uVar75 = uVar74 >> 8;
    *local_2b48 = CONCAT17((uVar73 != 0) * (uVar73 < 0x100) * (char)(uVar72 >> 8) - (0xff < uVar73),
                           CONCAT16((uVar65 != 0) * (uVar65 < 0x100) * (char)(uVar64 >> 8) -
                                    (0xff < uVar65),
                                    CONCAT15((uVar57 != 0) * (uVar57 < 0x100) * (char)(uVar56 >> 8)
                                             - (0xff < uVar57),
                                             CONCAT14((uVar49 != 0) * (uVar49 < 0x100) *
                                                      (char)(uVar48 >> 8) - (0xff < uVar49),
                                                      CONCAT13((uVar41 != 0) * (uVar41 < 0x100) *
                                                               (char)(uVar40 >> 8) - (0xff < uVar41)
                                                               ,CONCAT12((uVar33 != 0) *
                                                                         (uVar33 < 0x100) *
                                                                         (char)(uVar32 >> 8) -
                                                                         (0xff < uVar33),
                                                                         CONCAT11((uVar25 != 0) *
                                                                                  (uVar25 < 0x100) *
                                                                                  (char)(uVar24 >> 8
                                                                                        ) - (0xff < 
                                                  uVar25),(uVar16 != 0) * (uVar16 < 0x100) *
                                                          (char)(uVar15 >> 8) - (0xff < uVar16))))))
                                   ));
    local_2b48[1] =
         CONCAT17((uVar75 != 0) * (uVar75 < 0x100) * (char)(uVar74 >> 8) - (0xff < uVar75),
                  CONCAT16((uVar67 != 0) * (uVar67 < 0x100) * (char)(uVar66 >> 8) - (0xff < uVar67),
                           CONCAT15((uVar59 != 0) * (uVar59 < 0x100) * (char)(uVar58 >> 8) -
                                    (0xff < uVar59),
                                    CONCAT14((uVar51 != 0) * (uVar51 < 0x100) * (char)(uVar50 >> 8)
                                             - (0xff < uVar51),
                                             CONCAT13((uVar43 != 0) * (uVar43 < 0x100) *
                                                      (char)(uVar42 >> 8) - (0xff < uVar43),
                                                      CONCAT12((uVar35 != 0) * (uVar35 < 0x100) *
                                                               (char)(uVar34 >> 8) - (0xff < uVar35)
                                                               ,CONCAT11((uVar27 != 0) *
                                                                         (uVar27 < 0x100) *
                                                                         (char)(uVar26 >> 8) -
                                                                         (0xff < uVar27),
                                                                         (uVar18 != 0) *
                                                                         (uVar18 < 0x100) *
                                                                         (char)(uVar17 >> 8) -
                                                                         (0xff < uVar18))))))));
    uVar15 = sVar77 + local_908 * 0x90 + 0x80;
    uVar24 = sVar81 + sStack_906 * 0x8a + 0x80;
    uVar32 = sVar85 + sStack_904 * 0x85 + 0x80;
    uVar40 = sVar89 + sStack_902 * 0x7f + 0x80;
    uVar48 = sVar93 + sStack_900 * 0x79 + 0x80;
    uVar56 = sVar97 + sStack_8fe * 0x74 + 0x80;
    uVar64 = sVar101 + sStack_8fc * 0x6f + 0x80;
    uVar72 = sVar105 + sStack_8fa * 0x6a + 0x80;
    uVar16 = uVar15 >> 8;
    uVar25 = uVar24 >> 8;
    uVar33 = uVar32 >> 8;
    uVar41 = uVar40 >> 8;
    uVar49 = uVar48 >> 8;
    uVar57 = uVar56 >> 8;
    uVar65 = uVar64 >> 8;
    uVar73 = uVar72 >> 8;
    uVar17 = sVar78 + local_908 * 0x65 + 0x80;
    uVar26 = sVar82 + sStack_906 * 0x60 + 0x80;
    uVar34 = sVar86 + sStack_904 * 0x5b + 0x80;
    uVar42 = sVar90 + sStack_902 * 0x56 + 0x80;
    uVar50 = sVar94 + sStack_900 * 0x52 + 0x80;
    uVar58 = sVar98 + sStack_8fe * 0x4d + 0x80;
    uVar66 = sVar102 + sStack_8fc * 0x49 + 0x80;
    uVar74 = sVar106 + sStack_8fa * 0x45 + 0x80;
    uVar18 = uVar17 >> 8;
    uVar27 = uVar26 >> 8;
    uVar35 = uVar34 >> 8;
    uVar43 = uVar42 >> 8;
    uVar51 = uVar50 >> 8;
    uVar59 = uVar58 >> 8;
    uVar67 = uVar66 >> 8;
    uVar75 = uVar74 >> 8;
    local_2b48[2] =
         CONCAT17((uVar73 != 0) * (uVar73 < 0x100) * (char)(uVar72 >> 8) - (0xff < uVar73),
                  CONCAT16((uVar65 != 0) * (uVar65 < 0x100) * (char)(uVar64 >> 8) - (0xff < uVar65),
                           CONCAT15((uVar57 != 0) * (uVar57 < 0x100) * (char)(uVar56 >> 8) -
                                    (0xff < uVar57),
                                    CONCAT14((uVar49 != 0) * (uVar49 < 0x100) * (char)(uVar48 >> 8)
                                             - (0xff < uVar49),
                                             CONCAT13((uVar41 != 0) * (uVar41 < 0x100) *
                                                      (char)(uVar40 >> 8) - (0xff < uVar41),
                                                      CONCAT12((uVar33 != 0) * (uVar33 < 0x100) *
                                                               (char)(uVar32 >> 8) - (0xff < uVar33)
                                                               ,CONCAT11((uVar25 != 0) *
                                                                         (uVar25 < 0x100) *
                                                                         (char)(uVar24 >> 8) -
                                                                         (0xff < uVar25),
                                                                         (uVar16 != 0) *
                                                                         (uVar16 < 0x100) *
                                                                         (char)(uVar15 >> 8) -
                                                                         (0xff < uVar16))))))));
    local_2b48[3] =
         CONCAT17((uVar75 != 0) * (uVar75 < 0x100) * (char)(uVar74 >> 8) - (0xff < uVar75),
                  CONCAT16((uVar67 != 0) * (uVar67 < 0x100) * (char)(uVar66 >> 8) - (0xff < uVar67),
                           CONCAT15((uVar59 != 0) * (uVar59 < 0x100) * (char)(uVar58 >> 8) -
                                    (0xff < uVar59),
                                    CONCAT14((uVar51 != 0) * (uVar51 < 0x100) * (char)(uVar50 >> 8)
                                             - (0xff < uVar51),
                                             CONCAT13((uVar43 != 0) * (uVar43 < 0x100) *
                                                      (char)(uVar42 >> 8) - (0xff < uVar43),
                                                      CONCAT12((uVar35 != 0) * (uVar35 < 0x100) *
                                                               (char)(uVar34 >> 8) - (0xff < uVar35)
                                                               ,CONCAT11((uVar27 != 0) *
                                                                         (uVar27 < 0x100) *
                                                                         (char)(uVar26 >> 8) -
                                                                         (0xff < uVar27),
                                                                         (uVar18 != 0) *
                                                                         (uVar18 < 0x100) *
                                                                         (char)(uVar17 >> 8) -
                                                                         (0xff < uVar18))))))));
    uVar15 = sVar11 + local_908 * 0x41 + 0x80;
    uVar24 = sVar20 + sStack_906 * 0x3d + 0x80;
    uVar32 = sVar28 + sStack_904 * 0x39 + 0x80;
    uVar40 = sVar36 + sStack_902 * 0x36 + 0x80;
    uVar48 = sVar44 + sStack_900 * 0x32 + 0x80;
    uVar56 = sVar52 + sStack_8fe * 0x2f + 0x80;
    uVar64 = sVar60 + sStack_8fc * 0x2c + 0x80;
    uVar72 = sVar68 + sStack_8fa * 0x29 + 0x80;
    uVar16 = uVar15 >> 8;
    uVar25 = uVar24 >> 8;
    uVar33 = uVar32 >> 8;
    uVar41 = uVar40 >> 8;
    uVar49 = uVar48 >> 8;
    uVar57 = uVar56 >> 8;
    uVar65 = uVar64 >> 8;
    uVar73 = uVar72 >> 8;
    uVar17 = sVar12 + local_908 * 0x26 + 0x80;
    uVar26 = sVar21 + sStack_906 * 0x23 + 0x80;
    uVar34 = sVar29 + sStack_904 * 0x20 + 0x80;
    uVar42 = sVar37 + sStack_902 * 0x1d + 0x80;
    uVar50 = sVar45 + sStack_900 * 0x1b + 0x80;
    uVar58 = sVar53 + sStack_8fe * 0x19 + 0x80;
    uVar66 = sVar61 + sStack_8fc * 0x16 + 0x80;
    uVar74 = sVar69 + sStack_8fa * 0x14 + 0x80;
    uVar18 = uVar17 >> 8;
    uVar27 = uVar26 >> 8;
    uVar35 = uVar34 >> 8;
    uVar43 = uVar42 >> 8;
    uVar51 = uVar50 >> 8;
    uVar59 = uVar58 >> 8;
    uVar67 = uVar66 >> 8;
    uVar75 = uVar74 >> 8;
    local_2b48[4] =
         CONCAT17((uVar73 != 0) * (uVar73 < 0x100) * (char)(uVar72 >> 8) - (0xff < uVar73),
                  CONCAT16((uVar65 != 0) * (uVar65 < 0x100) * (char)(uVar64 >> 8) - (0xff < uVar65),
                           CONCAT15((uVar57 != 0) * (uVar57 < 0x100) * (char)(uVar56 >> 8) -
                                    (0xff < uVar57),
                                    CONCAT14((uVar49 != 0) * (uVar49 < 0x100) * (char)(uVar48 >> 8)
                                             - (0xff < uVar49),
                                             CONCAT13((uVar41 != 0) * (uVar41 < 0x100) *
                                                      (char)(uVar40 >> 8) - (0xff < uVar41),
                                                      CONCAT12((uVar33 != 0) * (uVar33 < 0x100) *
                                                               (char)(uVar32 >> 8) - (0xff < uVar33)
                                                               ,CONCAT11((uVar25 != 0) *
                                                                         (uVar25 < 0x100) *
                                                                         (char)(uVar24 >> 8) -
                                                                         (0xff < uVar25),
                                                                         (uVar16 != 0) *
                                                                         (uVar16 < 0x100) *
                                                                         (char)(uVar15 >> 8) -
                                                                         (0xff < uVar16))))))));
    local_2b48[5] =
         CONCAT17((uVar75 != 0) * (uVar75 < 0x100) * (char)(uVar74 >> 8) - (0xff < uVar75),
                  CONCAT16((uVar67 != 0) * (uVar67 < 0x100) * (char)(uVar66 >> 8) - (0xff < uVar67),
                           CONCAT15((uVar59 != 0) * (uVar59 < 0x100) * (char)(uVar58 >> 8) -
                                    (0xff < uVar59),
                                    CONCAT14((uVar51 != 0) * (uVar51 < 0x100) * (char)(uVar50 >> 8)
                                             - (0xff < uVar51),
                                             CONCAT13((uVar43 != 0) * (uVar43 < 0x100) *
                                                      (char)(uVar42 >> 8) - (0xff < uVar43),
                                                      CONCAT12((uVar35 != 0) * (uVar35 < 0x100) *
                                                               (char)(uVar34 >> 8) - (0xff < uVar35)
                                                               ,CONCAT11((uVar27 != 0) *
                                                                         (uVar27 < 0x100) *
                                                                         (char)(uVar26 >> 8) -
                                                                         (0xff < uVar27),
                                                                         (uVar18 != 0) *
                                                                         (uVar18 < 0x100) *
                                                                         (char)(uVar17 >> 8) -
                                                                         (0xff < uVar18))))))));
    uVar15 = sVar13 + local_908 * 0x12 + 0x80;
    uVar24 = sVar22 + sStack_906 * 0x10 + 0x80;
    uVar32 = sVar30 + sStack_904 * 0xf + 0x80;
    uVar40 = sVar38 + sStack_902 * 0xd + 0x80;
    uVar48 = sVar46 + sStack_900 * 0xc + 0x80;
    uVar56 = sVar54 + sStack_8fe * 10 + 0x80;
    uVar64 = sVar62 + sStack_8fc * 9 + 0x80;
    uVar72 = sVar70 + sStack_8fa * 8 + 0x80;
    uVar16 = uVar15 >> 8;
    uVar25 = uVar24 >> 8;
    uVar33 = uVar32 >> 8;
    uVar41 = uVar40 >> 8;
    uVar49 = uVar48 >> 8;
    uVar57 = uVar56 >> 8;
    uVar65 = uVar64 >> 8;
    uVar73 = uVar72 >> 8;
    uVar17 = sVar14 + local_908 * 7 + 0x80;
    uVar26 = sVar23 + sStack_906 * 6 + 0x80;
    uVar34 = sVar31 + sStack_904 * 6 + 0x80;
    uVar42 = sVar39 + sStack_902 * 5 + 0x80;
    uVar50 = sVar47 + sStack_900 * 5 + 0x80;
    uVar58 = sVar55 + sStack_8fe * 4 + 0x80;
    uVar66 = sVar63 + sStack_8fc * 4 + 0x80;
    uVar74 = sVar71 + sStack_8fa * 4 + 0x80;
    uVar18 = uVar17 >> 8;
    uVar27 = uVar26 >> 8;
    uVar35 = uVar34 >> 8;
    uVar43 = uVar42 >> 8;
    uVar51 = uVar50 >> 8;
    uVar59 = uVar58 >> 8;
    uVar67 = uVar66 >> 8;
    uVar75 = uVar74 >> 8;
    local_2b48[6] =
         CONCAT17((uVar73 != 0) * (uVar73 < 0x100) * (char)(uVar72 >> 8) - (0xff < uVar73),
                  CONCAT16((uVar65 != 0) * (uVar65 < 0x100) * (char)(uVar64 >> 8) - (0xff < uVar65),
                           CONCAT15((uVar57 != 0) * (uVar57 < 0x100) * (char)(uVar56 >> 8) -
                                    (0xff < uVar57),
                                    CONCAT14((uVar49 != 0) * (uVar49 < 0x100) * (char)(uVar48 >> 8)
                                             - (0xff < uVar49),
                                             CONCAT13((uVar41 != 0) * (uVar41 < 0x100) *
                                                      (char)(uVar40 >> 8) - (0xff < uVar41),
                                                      CONCAT12((uVar33 != 0) * (uVar33 < 0x100) *
                                                               (char)(uVar32 >> 8) - (0xff < uVar33)
                                                               ,CONCAT11((uVar25 != 0) *
                                                                         (uVar25 < 0x100) *
                                                                         (char)(uVar24 >> 8) -
                                                                         (0xff < uVar25),
                                                                         (uVar16 != 0) *
                                                                         (uVar16 < 0x100) *
                                                                         (char)(uVar15 >> 8) -
                                                                         (0xff < uVar16))))))));
    local_2b48[7] =
         CONCAT17((uVar75 != 0) * (uVar75 < 0x100) * (char)(uVar74 >> 8) - (0xff < uVar75),
                  CONCAT16((uVar67 != 0) * (uVar67 < 0x100) * (char)(uVar66 >> 8) - (0xff < uVar67),
                           CONCAT15((uVar59 != 0) * (uVar59 < 0x100) * (char)(uVar58 >> 8) -
                                    (0xff < uVar59),
                                    CONCAT14((uVar51 != 0) * (uVar51 < 0x100) * (char)(uVar50 >> 8)
                                             - (0xff < uVar51),
                                             CONCAT13((uVar43 != 0) * (uVar43 < 0x100) *
                                                      (char)(uVar42 >> 8) - (0xff < uVar43),
                                                      CONCAT12((uVar35 != 0) * (uVar35 < 0x100) *
                                                               (char)(uVar34 >> 8) - (0xff < uVar35)
                                                               ,CONCAT11((uVar27 != 0) *
                                                                         (uVar27 < 0x100) *
                                                                         (char)(uVar26 >> 8) -
                                                                         (0xff < uVar27),
                                                                         (uVar18 != 0) *
                                                                         (uVar18 < 0x100) *
                                                                         (char)(uVar17 >> 8) -
                                                                         (0xff < uVar18))))))));
    local_2b48 = (undefined8 *)(in_RSI + (long)local_2b48);
  }
  uVar1 = in_RCX[1];
  local_2a08 = (byte)uVar1;
  uStack_2a07 = (undefined1)((ulong)uVar1 >> 8);
  uStack_2a06 = (undefined1)((ulong)uVar1 >> 0x10);
  uStack_2a05 = (undefined1)((ulong)uVar1 >> 0x18);
  bStack_2a04 = (byte)((ulong)uVar1 >> 0x20);
  uStack_2a03 = (undefined1)((ulong)uVar1 >> 0x28);
  uStack_2a02 = (undefined1)((ulong)uVar1 >> 0x30);
  uStack_2a01 = (undefined1)((ulong)uVar1 >> 0x38);
  for (local_2dac = 0x1000100; local_2dac < 0xf0e0f0f; local_2dac = local_2dac + 0x2020202) {
    auVar6._4_4_ = local_2dac;
    auVar6._0_4_ = local_2dac;
    auVar6._12_4_ = local_2dac;
    auVar6._8_4_ = local_2dac;
    auVar7[1] = 0;
    auVar7[0] = local_2a08;
    auVar7[2] = uStack_2a07;
    auVar7[3] = 0;
    auVar7[4] = uStack_2a06;
    auVar7[5] = 0;
    auVar7[6] = uStack_2a05;
    auVar7[7] = 0;
    auVar7[9] = 0;
    auVar7[8] = bStack_2a04;
    auVar7[10] = uStack_2a03;
    auVar7[0xb] = 0;
    auVar7[0xc] = uStack_2a02;
    auVar7[0xd] = 0;
    auVar7[0xe] = uStack_2a01;
    auVar7[0xf] = 0;
    auVar19 = pshufb(auVar7,auVar6);
    local_1008 = auVar19._0_2_;
    sStack_1006 = auVar19._2_2_;
    sStack_1004 = auVar19._4_2_;
    sStack_1002 = auVar19._6_2_;
    sStack_1000 = auVar19._8_2_;
    sStack_ffe = auVar19._10_2_;
    sStack_ffc = auVar19._12_2_;
    sStack_ffa = auVar19._14_2_;
    uVar15 = uVar10 + local_1008 * 0xff + 0x80;
    uVar24 = sVar79 + sStack_1006 * 0xf8 + 0x80;
    uVar32 = sVar83 + sStack_1004 * 0xf0 + 0x80;
    uVar40 = sVar87 + sStack_1002 * 0xe9 + 0x80;
    uVar48 = sVar91 + sStack_1000 * 0xe1 + 0x80;
    uVar56 = sVar95 + sStack_ffe * 0xda + 0x80;
    uVar64 = sVar99 + sStack_ffc * 0xd2 + 0x80;
    uVar72 = sVar103 + sStack_ffa * 0xcb + 0x80;
    uVar16 = uVar15 >> 8;
    uVar25 = uVar24 >> 8;
    uVar33 = uVar32 >> 8;
    uVar41 = uVar40 >> 8;
    uVar49 = uVar48 >> 8;
    uVar57 = uVar56 >> 8;
    uVar65 = uVar64 >> 8;
    uVar73 = uVar72 >> 8;
    uVar17 = sVar76 + local_1008 * 0xc4 + 0x80;
    uVar26 = sVar80 + sStack_1006 * 0xbd + 0x80;
    uVar34 = sVar84 + sStack_1004 * 0xb6 + 0x80;
    uVar42 = sVar88 + sStack_1002 * 0xb0 + 0x80;
    uVar50 = sVar92 + sStack_1000 * 0xa9 + 0x80;
    uVar58 = sVar96 + sStack_ffe * 0xa3 + 0x80;
    uVar66 = sVar100 + sStack_ffc * 0x9c + 0x80;
    uVar74 = sVar104 + sStack_ffa * 0x96 + 0x80;
    uVar18 = uVar17 >> 8;
    uVar27 = uVar26 >> 8;
    uVar35 = uVar34 >> 8;
    uVar43 = uVar42 >> 8;
    uVar51 = uVar50 >> 8;
    uVar59 = uVar58 >> 8;
    uVar67 = uVar66 >> 8;
    uVar75 = uVar74 >> 8;
    *local_2b48 = CONCAT17((uVar73 != 0) * (uVar73 < 0x100) * (char)(uVar72 >> 8) - (0xff < uVar73),
                           CONCAT16((uVar65 != 0) * (uVar65 < 0x100) * (char)(uVar64 >> 8) -
                                    (0xff < uVar65),
                                    CONCAT15((uVar57 != 0) * (uVar57 < 0x100) * (char)(uVar56 >> 8)
                                             - (0xff < uVar57),
                                             CONCAT14((uVar49 != 0) * (uVar49 < 0x100) *
                                                      (char)(uVar48 >> 8) - (0xff < uVar49),
                                                      CONCAT13((uVar41 != 0) * (uVar41 < 0x100) *
                                                               (char)(uVar40 >> 8) - (0xff < uVar41)
                                                               ,CONCAT12((uVar33 != 0) *
                                                                         (uVar33 < 0x100) *
                                                                         (char)(uVar32 >> 8) -
                                                                         (0xff < uVar33),
                                                                         CONCAT11((uVar25 != 0) *
                                                                                  (uVar25 < 0x100) *
                                                                                  (char)(uVar24 >> 8
                                                                                        ) - (0xff < 
                                                  uVar25),(uVar16 != 0) * (uVar16 < 0x100) *
                                                          (char)(uVar15 >> 8) - (0xff < uVar16))))))
                                   ));
    local_2b48[1] =
         CONCAT17((uVar75 != 0) * (uVar75 < 0x100) * (char)(uVar74 >> 8) - (0xff < uVar75),
                  CONCAT16((uVar67 != 0) * (uVar67 < 0x100) * (char)(uVar66 >> 8) - (0xff < uVar67),
                           CONCAT15((uVar59 != 0) * (uVar59 < 0x100) * (char)(uVar58 >> 8) -
                                    (0xff < uVar59),
                                    CONCAT14((uVar51 != 0) * (uVar51 < 0x100) * (char)(uVar50 >> 8)
                                             - (0xff < uVar51),
                                             CONCAT13((uVar43 != 0) * (uVar43 < 0x100) *
                                                      (char)(uVar42 >> 8) - (0xff < uVar43),
                                                      CONCAT12((uVar35 != 0) * (uVar35 < 0x100) *
                                                               (char)(uVar34 >> 8) - (0xff < uVar35)
                                                               ,CONCAT11((uVar27 != 0) *
                                                                         (uVar27 < 0x100) *
                                                                         (char)(uVar26 >> 8) -
                                                                         (0xff < uVar27),
                                                                         (uVar18 != 0) *
                                                                         (uVar18 < 0x100) *
                                                                         (char)(uVar17 >> 8) -
                                                                         (0xff < uVar18))))))));
    uVar15 = sVar77 + local_1008 * 0x90 + 0x80;
    uVar24 = sVar81 + sStack_1006 * 0x8a + 0x80;
    uVar32 = sVar85 + sStack_1004 * 0x85 + 0x80;
    uVar40 = sVar89 + sStack_1002 * 0x7f + 0x80;
    uVar48 = sVar93 + sStack_1000 * 0x79 + 0x80;
    uVar56 = sVar97 + sStack_ffe * 0x74 + 0x80;
    uVar64 = sVar101 + sStack_ffc * 0x6f + 0x80;
    uVar72 = sVar105 + sStack_ffa * 0x6a + 0x80;
    uVar16 = uVar15 >> 8;
    uVar25 = uVar24 >> 8;
    uVar33 = uVar32 >> 8;
    uVar41 = uVar40 >> 8;
    uVar49 = uVar48 >> 8;
    uVar57 = uVar56 >> 8;
    uVar65 = uVar64 >> 8;
    uVar73 = uVar72 >> 8;
    uVar17 = sVar78 + local_1008 * 0x65 + 0x80;
    uVar26 = sVar82 + sStack_1006 * 0x60 + 0x80;
    uVar34 = sVar86 + sStack_1004 * 0x5b + 0x80;
    uVar42 = sVar90 + sStack_1002 * 0x56 + 0x80;
    uVar50 = sVar94 + sStack_1000 * 0x52 + 0x80;
    uVar58 = sVar98 + sStack_ffe * 0x4d + 0x80;
    uVar66 = sVar102 + sStack_ffc * 0x49 + 0x80;
    uVar74 = sVar106 + sStack_ffa * 0x45 + 0x80;
    uVar18 = uVar17 >> 8;
    uVar27 = uVar26 >> 8;
    uVar35 = uVar34 >> 8;
    uVar43 = uVar42 >> 8;
    uVar51 = uVar50 >> 8;
    uVar59 = uVar58 >> 8;
    uVar67 = uVar66 >> 8;
    uVar75 = uVar74 >> 8;
    local_2b48[2] =
         CONCAT17((uVar73 != 0) * (uVar73 < 0x100) * (char)(uVar72 >> 8) - (0xff < uVar73),
                  CONCAT16((uVar65 != 0) * (uVar65 < 0x100) * (char)(uVar64 >> 8) - (0xff < uVar65),
                           CONCAT15((uVar57 != 0) * (uVar57 < 0x100) * (char)(uVar56 >> 8) -
                                    (0xff < uVar57),
                                    CONCAT14((uVar49 != 0) * (uVar49 < 0x100) * (char)(uVar48 >> 8)
                                             - (0xff < uVar49),
                                             CONCAT13((uVar41 != 0) * (uVar41 < 0x100) *
                                                      (char)(uVar40 >> 8) - (0xff < uVar41),
                                                      CONCAT12((uVar33 != 0) * (uVar33 < 0x100) *
                                                               (char)(uVar32 >> 8) - (0xff < uVar33)
                                                               ,CONCAT11((uVar25 != 0) *
                                                                         (uVar25 < 0x100) *
                                                                         (char)(uVar24 >> 8) -
                                                                         (0xff < uVar25),
                                                                         (uVar16 != 0) *
                                                                         (uVar16 < 0x100) *
                                                                         (char)(uVar15 >> 8) -
                                                                         (0xff < uVar16))))))));
    local_2b48[3] =
         CONCAT17((uVar75 != 0) * (uVar75 < 0x100) * (char)(uVar74 >> 8) - (0xff < uVar75),
                  CONCAT16((uVar67 != 0) * (uVar67 < 0x100) * (char)(uVar66 >> 8) - (0xff < uVar67),
                           CONCAT15((uVar59 != 0) * (uVar59 < 0x100) * (char)(uVar58 >> 8) -
                                    (0xff < uVar59),
                                    CONCAT14((uVar51 != 0) * (uVar51 < 0x100) * (char)(uVar50 >> 8)
                                             - (0xff < uVar51),
                                             CONCAT13((uVar43 != 0) * (uVar43 < 0x100) *
                                                      (char)(uVar42 >> 8) - (0xff < uVar43),
                                                      CONCAT12((uVar35 != 0) * (uVar35 < 0x100) *
                                                               (char)(uVar34 >> 8) - (0xff < uVar35)
                                                               ,CONCAT11((uVar27 != 0) *
                                                                         (uVar27 < 0x100) *
                                                                         (char)(uVar26 >> 8) -
                                                                         (0xff < uVar27),
                                                                         (uVar18 != 0) *
                                                                         (uVar18 < 0x100) *
                                                                         (char)(uVar17 >> 8) -
                                                                         (0xff < uVar18))))))));
    uVar15 = sVar11 + local_1008 * 0x41 + 0x80;
    uVar24 = sVar20 + sStack_1006 * 0x3d + 0x80;
    uVar32 = sVar28 + sStack_1004 * 0x39 + 0x80;
    uVar40 = sVar36 + sStack_1002 * 0x36 + 0x80;
    uVar48 = sVar44 + sStack_1000 * 0x32 + 0x80;
    uVar56 = sVar52 + sStack_ffe * 0x2f + 0x80;
    uVar64 = sVar60 + sStack_ffc * 0x2c + 0x80;
    uVar72 = sVar68 + sStack_ffa * 0x29 + 0x80;
    uVar16 = uVar15 >> 8;
    uVar25 = uVar24 >> 8;
    uVar33 = uVar32 >> 8;
    uVar41 = uVar40 >> 8;
    uVar49 = uVar48 >> 8;
    uVar57 = uVar56 >> 8;
    uVar65 = uVar64 >> 8;
    uVar73 = uVar72 >> 8;
    uVar17 = sVar12 + local_1008 * 0x26 + 0x80;
    uVar26 = sVar21 + sStack_1006 * 0x23 + 0x80;
    uVar34 = sVar29 + sStack_1004 * 0x20 + 0x80;
    uVar42 = sVar37 + sStack_1002 * 0x1d + 0x80;
    uVar50 = sVar45 + sStack_1000 * 0x1b + 0x80;
    uVar58 = sVar53 + sStack_ffe * 0x19 + 0x80;
    uVar66 = sVar61 + sStack_ffc * 0x16 + 0x80;
    uVar74 = sVar69 + sStack_ffa * 0x14 + 0x80;
    uVar18 = uVar17 >> 8;
    uVar27 = uVar26 >> 8;
    uVar35 = uVar34 >> 8;
    uVar43 = uVar42 >> 8;
    uVar51 = uVar50 >> 8;
    uVar59 = uVar58 >> 8;
    uVar67 = uVar66 >> 8;
    uVar75 = uVar74 >> 8;
    local_2b48[4] =
         CONCAT17((uVar73 != 0) * (uVar73 < 0x100) * (char)(uVar72 >> 8) - (0xff < uVar73),
                  CONCAT16((uVar65 != 0) * (uVar65 < 0x100) * (char)(uVar64 >> 8) - (0xff < uVar65),
                           CONCAT15((uVar57 != 0) * (uVar57 < 0x100) * (char)(uVar56 >> 8) -
                                    (0xff < uVar57),
                                    CONCAT14((uVar49 != 0) * (uVar49 < 0x100) * (char)(uVar48 >> 8)
                                             - (0xff < uVar49),
                                             CONCAT13((uVar41 != 0) * (uVar41 < 0x100) *
                                                      (char)(uVar40 >> 8) - (0xff < uVar41),
                                                      CONCAT12((uVar33 != 0) * (uVar33 < 0x100) *
                                                               (char)(uVar32 >> 8) - (0xff < uVar33)
                                                               ,CONCAT11((uVar25 != 0) *
                                                                         (uVar25 < 0x100) *
                                                                         (char)(uVar24 >> 8) -
                                                                         (0xff < uVar25),
                                                                         (uVar16 != 0) *
                                                                         (uVar16 < 0x100) *
                                                                         (char)(uVar15 >> 8) -
                                                                         (0xff < uVar16))))))));
    local_2b48[5] =
         CONCAT17((uVar75 != 0) * (uVar75 < 0x100) * (char)(uVar74 >> 8) - (0xff < uVar75),
                  CONCAT16((uVar67 != 0) * (uVar67 < 0x100) * (char)(uVar66 >> 8) - (0xff < uVar67),
                           CONCAT15((uVar59 != 0) * (uVar59 < 0x100) * (char)(uVar58 >> 8) -
                                    (0xff < uVar59),
                                    CONCAT14((uVar51 != 0) * (uVar51 < 0x100) * (char)(uVar50 >> 8)
                                             - (0xff < uVar51),
                                             CONCAT13((uVar43 != 0) * (uVar43 < 0x100) *
                                                      (char)(uVar42 >> 8) - (0xff < uVar43),
                                                      CONCAT12((uVar35 != 0) * (uVar35 < 0x100) *
                                                               (char)(uVar34 >> 8) - (0xff < uVar35)
                                                               ,CONCAT11((uVar27 != 0) *
                                                                         (uVar27 < 0x100) *
                                                                         (char)(uVar26 >> 8) -
                                                                         (0xff < uVar27),
                                                                         (uVar18 != 0) *
                                                                         (uVar18 < 0x100) *
                                                                         (char)(uVar17 >> 8) -
                                                                         (0xff < uVar18))))))));
    uVar15 = sVar13 + local_1008 * 0x12 + 0x80;
    uVar24 = sVar22 + sStack_1006 * 0x10 + 0x80;
    uVar32 = sVar30 + sStack_1004 * 0xf + 0x80;
    uVar40 = sVar38 + sStack_1002 * 0xd + 0x80;
    uVar48 = sVar46 + sStack_1000 * 0xc + 0x80;
    uVar56 = sVar54 + sStack_ffe * 10 + 0x80;
    uVar64 = sVar62 + sStack_ffc * 9 + 0x80;
    uVar72 = sVar70 + sStack_ffa * 8 + 0x80;
    uVar16 = uVar15 >> 8;
    uVar25 = uVar24 >> 8;
    uVar33 = uVar32 >> 8;
    uVar41 = uVar40 >> 8;
    uVar49 = uVar48 >> 8;
    uVar57 = uVar56 >> 8;
    uVar65 = uVar64 >> 8;
    uVar73 = uVar72 >> 8;
    uVar17 = sVar14 + local_1008 * 7 + 0x80;
    uVar26 = sVar23 + sStack_1006 * 6 + 0x80;
    uVar34 = sVar31 + sStack_1004 * 6 + 0x80;
    uVar42 = sVar39 + sStack_1002 * 5 + 0x80;
    uVar50 = sVar47 + sStack_1000 * 5 + 0x80;
    uVar58 = sVar55 + sStack_ffe * 4 + 0x80;
    uVar66 = sVar63 + sStack_ffc * 4 + 0x80;
    uVar74 = sVar71 + sStack_ffa * 4 + 0x80;
    uVar18 = uVar17 >> 8;
    uVar27 = uVar26 >> 8;
    uVar35 = uVar34 >> 8;
    uVar43 = uVar42 >> 8;
    uVar51 = uVar50 >> 8;
    uVar59 = uVar58 >> 8;
    uVar67 = uVar66 >> 8;
    uVar75 = uVar74 >> 8;
    local_2b48[6] =
         CONCAT17((uVar73 != 0) * (uVar73 < 0x100) * (char)(uVar72 >> 8) - (0xff < uVar73),
                  CONCAT16((uVar65 != 0) * (uVar65 < 0x100) * (char)(uVar64 >> 8) - (0xff < uVar65),
                           CONCAT15((uVar57 != 0) * (uVar57 < 0x100) * (char)(uVar56 >> 8) -
                                    (0xff < uVar57),
                                    CONCAT14((uVar49 != 0) * (uVar49 < 0x100) * (char)(uVar48 >> 8)
                                             - (0xff < uVar49),
                                             CONCAT13((uVar41 != 0) * (uVar41 < 0x100) *
                                                      (char)(uVar40 >> 8) - (0xff < uVar41),
                                                      CONCAT12((uVar33 != 0) * (uVar33 < 0x100) *
                                                               (char)(uVar32 >> 8) - (0xff < uVar33)
                                                               ,CONCAT11((uVar25 != 0) *
                                                                         (uVar25 < 0x100) *
                                                                         (char)(uVar24 >> 8) -
                                                                         (0xff < uVar25),
                                                                         (uVar16 != 0) *
                                                                         (uVar16 < 0x100) *
                                                                         (char)(uVar15 >> 8) -
                                                                         (0xff < uVar16))))))));
    local_2b48[7] =
         CONCAT17((uVar75 != 0) * (uVar75 < 0x100) * (char)(uVar74 >> 8) - (0xff < uVar75),
                  CONCAT16((uVar67 != 0) * (uVar67 < 0x100) * (char)(uVar66 >> 8) - (0xff < uVar67),
                           CONCAT15((uVar59 != 0) * (uVar59 < 0x100) * (char)(uVar58 >> 8) -
                                    (0xff < uVar59),
                                    CONCAT14((uVar51 != 0) * (uVar51 < 0x100) * (char)(uVar50 >> 8)
                                             - (0xff < uVar51),
                                             CONCAT13((uVar43 != 0) * (uVar43 < 0x100) *
                                                      (char)(uVar42 >> 8) - (0xff < uVar43),
                                                      CONCAT12((uVar35 != 0) * (uVar35 < 0x100) *
                                                               (char)(uVar34 >> 8) - (0xff < uVar35)
                                                               ,CONCAT11((uVar27 != 0) *
                                                                         (uVar27 < 0x100) *
                                                                         (char)(uVar26 >> 8) -
                                                                         (0xff < uVar27),
                                                                         (uVar18 != 0) *
                                                                         (uVar18 < 0x100) *
                                                                         (char)(uVar17 >> 8) -
                                                                         (0xff < uVar18))))))));
    local_2b48 = (undefined8 *)(in_RSI + (long)local_2b48);
  }
  uVar1 = in_RCX[2];
  local_2a48 = (byte)uVar1;
  uStack_2a47 = (undefined1)((ulong)uVar1 >> 8);
  uStack_2a46 = (undefined1)((ulong)uVar1 >> 0x10);
  uStack_2a45 = (undefined1)((ulong)uVar1 >> 0x18);
  bStack_2a44 = (byte)((ulong)uVar1 >> 0x20);
  uStack_2a43 = (undefined1)((ulong)uVar1 >> 0x28);
  uStack_2a42 = (undefined1)((ulong)uVar1 >> 0x30);
  uStack_2a41 = (undefined1)((ulong)uVar1 >> 0x38);
  for (local_2dec = 0x1000100; local_2dec < 0xf0e0f0f; local_2dec = local_2dec + 0x2020202) {
    auVar4._4_4_ = local_2dec;
    auVar4._0_4_ = local_2dec;
    auVar4._12_4_ = local_2dec;
    auVar4._8_4_ = local_2dec;
    auVar5[1] = 0;
    auVar5[0] = local_2a48;
    auVar5[2] = uStack_2a47;
    auVar5[3] = 0;
    auVar5[4] = uStack_2a46;
    auVar5[5] = 0;
    auVar5[6] = uStack_2a45;
    auVar5[7] = 0;
    auVar5[9] = 0;
    auVar5[8] = bStack_2a44;
    auVar5[10] = uStack_2a43;
    auVar5[0xb] = 0;
    auVar5[0xc] = uStack_2a42;
    auVar5[0xd] = 0;
    auVar5[0xe] = uStack_2a41;
    auVar5[0xf] = 0;
    auVar19 = pshufb(auVar5,auVar4);
    local_1708 = auVar19._0_2_;
    sStack_1706 = auVar19._2_2_;
    sStack_1704 = auVar19._4_2_;
    sStack_1702 = auVar19._6_2_;
    sStack_1700 = auVar19._8_2_;
    sStack_16fe = auVar19._10_2_;
    sStack_16fc = auVar19._12_2_;
    sStack_16fa = auVar19._14_2_;
    uVar15 = uVar10 + local_1708 * 0xff + 0x80;
    uVar24 = sVar79 + sStack_1706 * 0xf8 + 0x80;
    uVar32 = sVar83 + sStack_1704 * 0xf0 + 0x80;
    uVar40 = sVar87 + sStack_1702 * 0xe9 + 0x80;
    uVar48 = sVar91 + sStack_1700 * 0xe1 + 0x80;
    uVar56 = sVar95 + sStack_16fe * 0xda + 0x80;
    uVar64 = sVar99 + sStack_16fc * 0xd2 + 0x80;
    uVar72 = sVar103 + sStack_16fa * 0xcb + 0x80;
    uVar16 = uVar15 >> 8;
    uVar25 = uVar24 >> 8;
    uVar33 = uVar32 >> 8;
    uVar41 = uVar40 >> 8;
    uVar49 = uVar48 >> 8;
    uVar57 = uVar56 >> 8;
    uVar65 = uVar64 >> 8;
    uVar73 = uVar72 >> 8;
    uVar17 = sVar76 + local_1708 * 0xc4 + 0x80;
    uVar26 = sVar80 + sStack_1706 * 0xbd + 0x80;
    uVar34 = sVar84 + sStack_1704 * 0xb6 + 0x80;
    uVar42 = sVar88 + sStack_1702 * 0xb0 + 0x80;
    uVar50 = sVar92 + sStack_1700 * 0xa9 + 0x80;
    uVar58 = sVar96 + sStack_16fe * 0xa3 + 0x80;
    uVar66 = sVar100 + sStack_16fc * 0x9c + 0x80;
    uVar74 = sVar104 + sStack_16fa * 0x96 + 0x80;
    uVar18 = uVar17 >> 8;
    uVar27 = uVar26 >> 8;
    uVar35 = uVar34 >> 8;
    uVar43 = uVar42 >> 8;
    uVar51 = uVar50 >> 8;
    uVar59 = uVar58 >> 8;
    uVar67 = uVar66 >> 8;
    uVar75 = uVar74 >> 8;
    *local_2b48 = CONCAT17((uVar73 != 0) * (uVar73 < 0x100) * (char)(uVar72 >> 8) - (0xff < uVar73),
                           CONCAT16((uVar65 != 0) * (uVar65 < 0x100) * (char)(uVar64 >> 8) -
                                    (0xff < uVar65),
                                    CONCAT15((uVar57 != 0) * (uVar57 < 0x100) * (char)(uVar56 >> 8)
                                             - (0xff < uVar57),
                                             CONCAT14((uVar49 != 0) * (uVar49 < 0x100) *
                                                      (char)(uVar48 >> 8) - (0xff < uVar49),
                                                      CONCAT13((uVar41 != 0) * (uVar41 < 0x100) *
                                                               (char)(uVar40 >> 8) - (0xff < uVar41)
                                                               ,CONCAT12((uVar33 != 0) *
                                                                         (uVar33 < 0x100) *
                                                                         (char)(uVar32 >> 8) -
                                                                         (0xff < uVar33),
                                                                         CONCAT11((uVar25 != 0) *
                                                                                  (uVar25 < 0x100) *
                                                                                  (char)(uVar24 >> 8
                                                                                        ) - (0xff < 
                                                  uVar25),(uVar16 != 0) * (uVar16 < 0x100) *
                                                          (char)(uVar15 >> 8) - (0xff < uVar16))))))
                                   ));
    local_2b48[1] =
         CONCAT17((uVar75 != 0) * (uVar75 < 0x100) * (char)(uVar74 >> 8) - (0xff < uVar75),
                  CONCAT16((uVar67 != 0) * (uVar67 < 0x100) * (char)(uVar66 >> 8) - (0xff < uVar67),
                           CONCAT15((uVar59 != 0) * (uVar59 < 0x100) * (char)(uVar58 >> 8) -
                                    (0xff < uVar59),
                                    CONCAT14((uVar51 != 0) * (uVar51 < 0x100) * (char)(uVar50 >> 8)
                                             - (0xff < uVar51),
                                             CONCAT13((uVar43 != 0) * (uVar43 < 0x100) *
                                                      (char)(uVar42 >> 8) - (0xff < uVar43),
                                                      CONCAT12((uVar35 != 0) * (uVar35 < 0x100) *
                                                               (char)(uVar34 >> 8) - (0xff < uVar35)
                                                               ,CONCAT11((uVar27 != 0) *
                                                                         (uVar27 < 0x100) *
                                                                         (char)(uVar26 >> 8) -
                                                                         (0xff < uVar27),
                                                                         (uVar18 != 0) *
                                                                         (uVar18 < 0x100) *
                                                                         (char)(uVar17 >> 8) -
                                                                         (0xff < uVar18))))))));
    uVar15 = sVar77 + local_1708 * 0x90 + 0x80;
    uVar24 = sVar81 + sStack_1706 * 0x8a + 0x80;
    uVar32 = sVar85 + sStack_1704 * 0x85 + 0x80;
    uVar40 = sVar89 + sStack_1702 * 0x7f + 0x80;
    uVar48 = sVar93 + sStack_1700 * 0x79 + 0x80;
    uVar56 = sVar97 + sStack_16fe * 0x74 + 0x80;
    uVar64 = sVar101 + sStack_16fc * 0x6f + 0x80;
    uVar72 = sVar105 + sStack_16fa * 0x6a + 0x80;
    uVar16 = uVar15 >> 8;
    uVar25 = uVar24 >> 8;
    uVar33 = uVar32 >> 8;
    uVar41 = uVar40 >> 8;
    uVar49 = uVar48 >> 8;
    uVar57 = uVar56 >> 8;
    uVar65 = uVar64 >> 8;
    uVar73 = uVar72 >> 8;
    uVar17 = sVar78 + local_1708 * 0x65 + 0x80;
    uVar26 = sVar82 + sStack_1706 * 0x60 + 0x80;
    uVar34 = sVar86 + sStack_1704 * 0x5b + 0x80;
    uVar42 = sVar90 + sStack_1702 * 0x56 + 0x80;
    uVar50 = sVar94 + sStack_1700 * 0x52 + 0x80;
    uVar58 = sVar98 + sStack_16fe * 0x4d + 0x80;
    uVar66 = sVar102 + sStack_16fc * 0x49 + 0x80;
    uVar74 = sVar106 + sStack_16fa * 0x45 + 0x80;
    uVar18 = uVar17 >> 8;
    uVar27 = uVar26 >> 8;
    uVar35 = uVar34 >> 8;
    uVar43 = uVar42 >> 8;
    uVar51 = uVar50 >> 8;
    uVar59 = uVar58 >> 8;
    uVar67 = uVar66 >> 8;
    uVar75 = uVar74 >> 8;
    local_2b48[2] =
         CONCAT17((uVar73 != 0) * (uVar73 < 0x100) * (char)(uVar72 >> 8) - (0xff < uVar73),
                  CONCAT16((uVar65 != 0) * (uVar65 < 0x100) * (char)(uVar64 >> 8) - (0xff < uVar65),
                           CONCAT15((uVar57 != 0) * (uVar57 < 0x100) * (char)(uVar56 >> 8) -
                                    (0xff < uVar57),
                                    CONCAT14((uVar49 != 0) * (uVar49 < 0x100) * (char)(uVar48 >> 8)
                                             - (0xff < uVar49),
                                             CONCAT13((uVar41 != 0) * (uVar41 < 0x100) *
                                                      (char)(uVar40 >> 8) - (0xff < uVar41),
                                                      CONCAT12((uVar33 != 0) * (uVar33 < 0x100) *
                                                               (char)(uVar32 >> 8) - (0xff < uVar33)
                                                               ,CONCAT11((uVar25 != 0) *
                                                                         (uVar25 < 0x100) *
                                                                         (char)(uVar24 >> 8) -
                                                                         (0xff < uVar25),
                                                                         (uVar16 != 0) *
                                                                         (uVar16 < 0x100) *
                                                                         (char)(uVar15 >> 8) -
                                                                         (0xff < uVar16))))))));
    local_2b48[3] =
         CONCAT17((uVar75 != 0) * (uVar75 < 0x100) * (char)(uVar74 >> 8) - (0xff < uVar75),
                  CONCAT16((uVar67 != 0) * (uVar67 < 0x100) * (char)(uVar66 >> 8) - (0xff < uVar67),
                           CONCAT15((uVar59 != 0) * (uVar59 < 0x100) * (char)(uVar58 >> 8) -
                                    (0xff < uVar59),
                                    CONCAT14((uVar51 != 0) * (uVar51 < 0x100) * (char)(uVar50 >> 8)
                                             - (0xff < uVar51),
                                             CONCAT13((uVar43 != 0) * (uVar43 < 0x100) *
                                                      (char)(uVar42 >> 8) - (0xff < uVar43),
                                                      CONCAT12((uVar35 != 0) * (uVar35 < 0x100) *
                                                               (char)(uVar34 >> 8) - (0xff < uVar35)
                                                               ,CONCAT11((uVar27 != 0) *
                                                                         (uVar27 < 0x100) *
                                                                         (char)(uVar26 >> 8) -
                                                                         (0xff < uVar27),
                                                                         (uVar18 != 0) *
                                                                         (uVar18 < 0x100) *
                                                                         (char)(uVar17 >> 8) -
                                                                         (0xff < uVar18))))))));
    uVar15 = sVar11 + local_1708 * 0x41 + 0x80;
    uVar24 = sVar20 + sStack_1706 * 0x3d + 0x80;
    uVar32 = sVar28 + sStack_1704 * 0x39 + 0x80;
    uVar40 = sVar36 + sStack_1702 * 0x36 + 0x80;
    uVar48 = sVar44 + sStack_1700 * 0x32 + 0x80;
    uVar56 = sVar52 + sStack_16fe * 0x2f + 0x80;
    uVar64 = sVar60 + sStack_16fc * 0x2c + 0x80;
    uVar72 = sVar68 + sStack_16fa * 0x29 + 0x80;
    uVar16 = uVar15 >> 8;
    uVar25 = uVar24 >> 8;
    uVar33 = uVar32 >> 8;
    uVar41 = uVar40 >> 8;
    uVar49 = uVar48 >> 8;
    uVar57 = uVar56 >> 8;
    uVar65 = uVar64 >> 8;
    uVar73 = uVar72 >> 8;
    uVar17 = sVar12 + local_1708 * 0x26 + 0x80;
    uVar26 = sVar21 + sStack_1706 * 0x23 + 0x80;
    uVar34 = sVar29 + sStack_1704 * 0x20 + 0x80;
    uVar42 = sVar37 + sStack_1702 * 0x1d + 0x80;
    uVar50 = sVar45 + sStack_1700 * 0x1b + 0x80;
    uVar58 = sVar53 + sStack_16fe * 0x19 + 0x80;
    uVar66 = sVar61 + sStack_16fc * 0x16 + 0x80;
    uVar74 = sVar69 + sStack_16fa * 0x14 + 0x80;
    uVar18 = uVar17 >> 8;
    uVar27 = uVar26 >> 8;
    uVar35 = uVar34 >> 8;
    uVar43 = uVar42 >> 8;
    uVar51 = uVar50 >> 8;
    uVar59 = uVar58 >> 8;
    uVar67 = uVar66 >> 8;
    uVar75 = uVar74 >> 8;
    local_2b48[4] =
         CONCAT17((uVar73 != 0) * (uVar73 < 0x100) * (char)(uVar72 >> 8) - (0xff < uVar73),
                  CONCAT16((uVar65 != 0) * (uVar65 < 0x100) * (char)(uVar64 >> 8) - (0xff < uVar65),
                           CONCAT15((uVar57 != 0) * (uVar57 < 0x100) * (char)(uVar56 >> 8) -
                                    (0xff < uVar57),
                                    CONCAT14((uVar49 != 0) * (uVar49 < 0x100) * (char)(uVar48 >> 8)
                                             - (0xff < uVar49),
                                             CONCAT13((uVar41 != 0) * (uVar41 < 0x100) *
                                                      (char)(uVar40 >> 8) - (0xff < uVar41),
                                                      CONCAT12((uVar33 != 0) * (uVar33 < 0x100) *
                                                               (char)(uVar32 >> 8) - (0xff < uVar33)
                                                               ,CONCAT11((uVar25 != 0) *
                                                                         (uVar25 < 0x100) *
                                                                         (char)(uVar24 >> 8) -
                                                                         (0xff < uVar25),
                                                                         (uVar16 != 0) *
                                                                         (uVar16 < 0x100) *
                                                                         (char)(uVar15 >> 8) -
                                                                         (0xff < uVar16))))))));
    local_2b48[5] =
         CONCAT17((uVar75 != 0) * (uVar75 < 0x100) * (char)(uVar74 >> 8) - (0xff < uVar75),
                  CONCAT16((uVar67 != 0) * (uVar67 < 0x100) * (char)(uVar66 >> 8) - (0xff < uVar67),
                           CONCAT15((uVar59 != 0) * (uVar59 < 0x100) * (char)(uVar58 >> 8) -
                                    (0xff < uVar59),
                                    CONCAT14((uVar51 != 0) * (uVar51 < 0x100) * (char)(uVar50 >> 8)
                                             - (0xff < uVar51),
                                             CONCAT13((uVar43 != 0) * (uVar43 < 0x100) *
                                                      (char)(uVar42 >> 8) - (0xff < uVar43),
                                                      CONCAT12((uVar35 != 0) * (uVar35 < 0x100) *
                                                               (char)(uVar34 >> 8) - (0xff < uVar35)
                                                               ,CONCAT11((uVar27 != 0) *
                                                                         (uVar27 < 0x100) *
                                                                         (char)(uVar26 >> 8) -
                                                                         (0xff < uVar27),
                                                                         (uVar18 != 0) *
                                                                         (uVar18 < 0x100) *
                                                                         (char)(uVar17 >> 8) -
                                                                         (0xff < uVar18))))))));
    uVar15 = sVar13 + local_1708 * 0x12 + 0x80;
    uVar24 = sVar22 + sStack_1706 * 0x10 + 0x80;
    uVar32 = sVar30 + sStack_1704 * 0xf + 0x80;
    uVar40 = sVar38 + sStack_1702 * 0xd + 0x80;
    uVar48 = sVar46 + sStack_1700 * 0xc + 0x80;
    uVar56 = sVar54 + sStack_16fe * 10 + 0x80;
    uVar64 = sVar62 + sStack_16fc * 9 + 0x80;
    uVar72 = sVar70 + sStack_16fa * 8 + 0x80;
    uVar16 = uVar15 >> 8;
    uVar25 = uVar24 >> 8;
    uVar33 = uVar32 >> 8;
    uVar41 = uVar40 >> 8;
    uVar49 = uVar48 >> 8;
    uVar57 = uVar56 >> 8;
    uVar65 = uVar64 >> 8;
    uVar73 = uVar72 >> 8;
    uVar17 = sVar14 + local_1708 * 7 + 0x80;
    uVar26 = sVar23 + sStack_1706 * 6 + 0x80;
    uVar34 = sVar31 + sStack_1704 * 6 + 0x80;
    uVar42 = sVar39 + sStack_1702 * 5 + 0x80;
    uVar50 = sVar47 + sStack_1700 * 5 + 0x80;
    uVar58 = sVar55 + sStack_16fe * 4 + 0x80;
    uVar66 = sVar63 + sStack_16fc * 4 + 0x80;
    uVar74 = sVar71 + sStack_16fa * 4 + 0x80;
    uVar18 = uVar17 >> 8;
    uVar27 = uVar26 >> 8;
    uVar35 = uVar34 >> 8;
    uVar43 = uVar42 >> 8;
    uVar51 = uVar50 >> 8;
    uVar59 = uVar58 >> 8;
    uVar67 = uVar66 >> 8;
    uVar75 = uVar74 >> 8;
    local_2b48[6] =
         CONCAT17((uVar73 != 0) * (uVar73 < 0x100) * (char)(uVar72 >> 8) - (0xff < uVar73),
                  CONCAT16((uVar65 != 0) * (uVar65 < 0x100) * (char)(uVar64 >> 8) - (0xff < uVar65),
                           CONCAT15((uVar57 != 0) * (uVar57 < 0x100) * (char)(uVar56 >> 8) -
                                    (0xff < uVar57),
                                    CONCAT14((uVar49 != 0) * (uVar49 < 0x100) * (char)(uVar48 >> 8)
                                             - (0xff < uVar49),
                                             CONCAT13((uVar41 != 0) * (uVar41 < 0x100) *
                                                      (char)(uVar40 >> 8) - (0xff < uVar41),
                                                      CONCAT12((uVar33 != 0) * (uVar33 < 0x100) *
                                                               (char)(uVar32 >> 8) - (0xff < uVar33)
                                                               ,CONCAT11((uVar25 != 0) *
                                                                         (uVar25 < 0x100) *
                                                                         (char)(uVar24 >> 8) -
                                                                         (0xff < uVar25),
                                                                         (uVar16 != 0) *
                                                                         (uVar16 < 0x100) *
                                                                         (char)(uVar15 >> 8) -
                                                                         (0xff < uVar16))))))));
    local_2b48[7] =
         CONCAT17((uVar75 != 0) * (uVar75 < 0x100) * (char)(uVar74 >> 8) - (0xff < uVar75),
                  CONCAT16((uVar67 != 0) * (uVar67 < 0x100) * (char)(uVar66 >> 8) - (0xff < uVar67),
                           CONCAT15((uVar59 != 0) * (uVar59 < 0x100) * (char)(uVar58 >> 8) -
                                    (0xff < uVar59),
                                    CONCAT14((uVar51 != 0) * (uVar51 < 0x100) * (char)(uVar50 >> 8)
                                             - (0xff < uVar51),
                                             CONCAT13((uVar43 != 0) * (uVar43 < 0x100) *
                                                      (char)(uVar42 >> 8) - (0xff < uVar43),
                                                      CONCAT12((uVar35 != 0) * (uVar35 < 0x100) *
                                                               (char)(uVar34 >> 8) - (0xff < uVar35)
                                                               ,CONCAT11((uVar27 != 0) *
                                                                         (uVar27 < 0x100) *
                                                                         (char)(uVar26 >> 8) -
                                                                         (0xff < uVar27),
                                                                         (uVar18 != 0) *
                                                                         (uVar18 < 0x100) *
                                                                         (char)(uVar17 >> 8) -
                                                                         (0xff < uVar18))))))));
    local_2b48 = (undefined8 *)(in_RSI + (long)local_2b48);
  }
  uVar1 = in_RCX[3];
  local_2a88 = (byte)uVar1;
  uStack_2a87 = (undefined1)((ulong)uVar1 >> 8);
  uStack_2a86 = (undefined1)((ulong)uVar1 >> 0x10);
  uStack_2a85 = (undefined1)((ulong)uVar1 >> 0x18);
  bStack_2a84 = (byte)((ulong)uVar1 >> 0x20);
  uStack_2a83 = (undefined1)((ulong)uVar1 >> 0x28);
  uStack_2a82 = (undefined1)((ulong)uVar1 >> 0x30);
  uStack_2a81 = (undefined1)((ulong)uVar1 >> 0x38);
  for (local_2e2c = 0x1000100; local_2e2c < 0xf0e0f0f; local_2e2c = local_2e2c + 0x2020202) {
    auVar19._4_4_ = local_2e2c;
    auVar19._0_4_ = local_2e2c;
    auVar19._12_4_ = local_2e2c;
    auVar19._8_4_ = local_2e2c;
    auVar3[1] = 0;
    auVar3[0] = local_2a88;
    auVar3[2] = uStack_2a87;
    auVar3[3] = 0;
    auVar3[4] = uStack_2a86;
    auVar3[5] = 0;
    auVar3[6] = uStack_2a85;
    auVar3[7] = 0;
    auVar3[9] = 0;
    auVar3[8] = bStack_2a84;
    auVar3[10] = uStack_2a83;
    auVar3[0xb] = 0;
    auVar3[0xc] = uStack_2a82;
    auVar3[0xd] = 0;
    auVar3[0xe] = uStack_2a81;
    auVar3[0xf] = 0;
    auVar19 = pshufb(auVar3,auVar19);
    local_1e08 = auVar19._0_2_;
    sStack_1e06 = auVar19._2_2_;
    sStack_1e04 = auVar19._4_2_;
    sStack_1e02 = auVar19._6_2_;
    sStack_1e00 = auVar19._8_2_;
    sStack_1dfe = auVar19._10_2_;
    sStack_1dfc = auVar19._12_2_;
    sStack_1dfa = auVar19._14_2_;
    uVar15 = uVar10 + local_1e08 * 0xff + 0x80;
    uVar24 = sVar79 + sStack_1e06 * 0xf8 + 0x80;
    uVar32 = sVar83 + sStack_1e04 * 0xf0 + 0x80;
    uVar40 = sVar87 + sStack_1e02 * 0xe9 + 0x80;
    uVar48 = sVar91 + sStack_1e00 * 0xe1 + 0x80;
    uVar56 = sVar95 + sStack_1dfe * 0xda + 0x80;
    uVar64 = sVar99 + sStack_1dfc * 0xd2 + 0x80;
    uVar72 = sVar103 + sStack_1dfa * 0xcb + 0x80;
    uVar16 = uVar15 >> 8;
    uVar25 = uVar24 >> 8;
    uVar33 = uVar32 >> 8;
    uVar41 = uVar40 >> 8;
    uVar49 = uVar48 >> 8;
    uVar57 = uVar56 >> 8;
    uVar65 = uVar64 >> 8;
    uVar73 = uVar72 >> 8;
    uVar17 = sVar76 + local_1e08 * 0xc4 + 0x80;
    uVar26 = sVar80 + sStack_1e06 * 0xbd + 0x80;
    uVar34 = sVar84 + sStack_1e04 * 0xb6 + 0x80;
    uVar42 = sVar88 + sStack_1e02 * 0xb0 + 0x80;
    uVar50 = sVar92 + sStack_1e00 * 0xa9 + 0x80;
    uVar58 = sVar96 + sStack_1dfe * 0xa3 + 0x80;
    uVar66 = sVar100 + sStack_1dfc * 0x9c + 0x80;
    uVar74 = sVar104 + sStack_1dfa * 0x96 + 0x80;
    uVar18 = uVar17 >> 8;
    uVar27 = uVar26 >> 8;
    uVar35 = uVar34 >> 8;
    uVar43 = uVar42 >> 8;
    uVar51 = uVar50 >> 8;
    uVar59 = uVar58 >> 8;
    uVar67 = uVar66 >> 8;
    uVar75 = uVar74 >> 8;
    *local_2b48 = CONCAT17((uVar73 != 0) * (uVar73 < 0x100) * (char)(uVar72 >> 8) - (0xff < uVar73),
                           CONCAT16((uVar65 != 0) * (uVar65 < 0x100) * (char)(uVar64 >> 8) -
                                    (0xff < uVar65),
                                    CONCAT15((uVar57 != 0) * (uVar57 < 0x100) * (char)(uVar56 >> 8)
                                             - (0xff < uVar57),
                                             CONCAT14((uVar49 != 0) * (uVar49 < 0x100) *
                                                      (char)(uVar48 >> 8) - (0xff < uVar49),
                                                      CONCAT13((uVar41 != 0) * (uVar41 < 0x100) *
                                                               (char)(uVar40 >> 8) - (0xff < uVar41)
                                                               ,CONCAT12((uVar33 != 0) *
                                                                         (uVar33 < 0x100) *
                                                                         (char)(uVar32 >> 8) -
                                                                         (0xff < uVar33),
                                                                         CONCAT11((uVar25 != 0) *
                                                                                  (uVar25 < 0x100) *
                                                                                  (char)(uVar24 >> 8
                                                                                        ) - (0xff < 
                                                  uVar25),(uVar16 != 0) * (uVar16 < 0x100) *
                                                          (char)(uVar15 >> 8) - (0xff < uVar16))))))
                                   ));
    local_2b48[1] =
         CONCAT17((uVar75 != 0) * (uVar75 < 0x100) * (char)(uVar74 >> 8) - (0xff < uVar75),
                  CONCAT16((uVar67 != 0) * (uVar67 < 0x100) * (char)(uVar66 >> 8) - (0xff < uVar67),
                           CONCAT15((uVar59 != 0) * (uVar59 < 0x100) * (char)(uVar58 >> 8) -
                                    (0xff < uVar59),
                                    CONCAT14((uVar51 != 0) * (uVar51 < 0x100) * (char)(uVar50 >> 8)
                                             - (0xff < uVar51),
                                             CONCAT13((uVar43 != 0) * (uVar43 < 0x100) *
                                                      (char)(uVar42 >> 8) - (0xff < uVar43),
                                                      CONCAT12((uVar35 != 0) * (uVar35 < 0x100) *
                                                               (char)(uVar34 >> 8) - (0xff < uVar35)
                                                               ,CONCAT11((uVar27 != 0) *
                                                                         (uVar27 < 0x100) *
                                                                         (char)(uVar26 >> 8) -
                                                                         (0xff < uVar27),
                                                                         (uVar18 != 0) *
                                                                         (uVar18 < 0x100) *
                                                                         (char)(uVar17 >> 8) -
                                                                         (0xff < uVar18))))))));
    uVar15 = sVar77 + local_1e08 * 0x90 + 0x80;
    uVar24 = sVar81 + sStack_1e06 * 0x8a + 0x80;
    uVar32 = sVar85 + sStack_1e04 * 0x85 + 0x80;
    uVar40 = sVar89 + sStack_1e02 * 0x7f + 0x80;
    uVar48 = sVar93 + sStack_1e00 * 0x79 + 0x80;
    uVar56 = sVar97 + sStack_1dfe * 0x74 + 0x80;
    uVar64 = sVar101 + sStack_1dfc * 0x6f + 0x80;
    uVar72 = sVar105 + sStack_1dfa * 0x6a + 0x80;
    uVar16 = uVar15 >> 8;
    uVar25 = uVar24 >> 8;
    uVar33 = uVar32 >> 8;
    uVar41 = uVar40 >> 8;
    uVar49 = uVar48 >> 8;
    uVar57 = uVar56 >> 8;
    uVar65 = uVar64 >> 8;
    uVar73 = uVar72 >> 8;
    uVar17 = sVar78 + local_1e08 * 0x65 + 0x80;
    uVar26 = sVar82 + sStack_1e06 * 0x60 + 0x80;
    uVar34 = sVar86 + sStack_1e04 * 0x5b + 0x80;
    uVar42 = sVar90 + sStack_1e02 * 0x56 + 0x80;
    uVar50 = sVar94 + sStack_1e00 * 0x52 + 0x80;
    uVar58 = sVar98 + sStack_1dfe * 0x4d + 0x80;
    uVar66 = sVar102 + sStack_1dfc * 0x49 + 0x80;
    uVar74 = sVar106 + sStack_1dfa * 0x45 + 0x80;
    uVar18 = uVar17 >> 8;
    uVar27 = uVar26 >> 8;
    uVar35 = uVar34 >> 8;
    uVar43 = uVar42 >> 8;
    uVar51 = uVar50 >> 8;
    uVar59 = uVar58 >> 8;
    uVar67 = uVar66 >> 8;
    uVar75 = uVar74 >> 8;
    local_2b48[2] =
         CONCAT17((uVar73 != 0) * (uVar73 < 0x100) * (char)(uVar72 >> 8) - (0xff < uVar73),
                  CONCAT16((uVar65 != 0) * (uVar65 < 0x100) * (char)(uVar64 >> 8) - (0xff < uVar65),
                           CONCAT15((uVar57 != 0) * (uVar57 < 0x100) * (char)(uVar56 >> 8) -
                                    (0xff < uVar57),
                                    CONCAT14((uVar49 != 0) * (uVar49 < 0x100) * (char)(uVar48 >> 8)
                                             - (0xff < uVar49),
                                             CONCAT13((uVar41 != 0) * (uVar41 < 0x100) *
                                                      (char)(uVar40 >> 8) - (0xff < uVar41),
                                                      CONCAT12((uVar33 != 0) * (uVar33 < 0x100) *
                                                               (char)(uVar32 >> 8) - (0xff < uVar33)
                                                               ,CONCAT11((uVar25 != 0) *
                                                                         (uVar25 < 0x100) *
                                                                         (char)(uVar24 >> 8) -
                                                                         (0xff < uVar25),
                                                                         (uVar16 != 0) *
                                                                         (uVar16 < 0x100) *
                                                                         (char)(uVar15 >> 8) -
                                                                         (0xff < uVar16))))))));
    local_2b48[3] =
         CONCAT17((uVar75 != 0) * (uVar75 < 0x100) * (char)(uVar74 >> 8) - (0xff < uVar75),
                  CONCAT16((uVar67 != 0) * (uVar67 < 0x100) * (char)(uVar66 >> 8) - (0xff < uVar67),
                           CONCAT15((uVar59 != 0) * (uVar59 < 0x100) * (char)(uVar58 >> 8) -
                                    (0xff < uVar59),
                                    CONCAT14((uVar51 != 0) * (uVar51 < 0x100) * (char)(uVar50 >> 8)
                                             - (0xff < uVar51),
                                             CONCAT13((uVar43 != 0) * (uVar43 < 0x100) *
                                                      (char)(uVar42 >> 8) - (0xff < uVar43),
                                                      CONCAT12((uVar35 != 0) * (uVar35 < 0x100) *
                                                               (char)(uVar34 >> 8) - (0xff < uVar35)
                                                               ,CONCAT11((uVar27 != 0) *
                                                                         (uVar27 < 0x100) *
                                                                         (char)(uVar26 >> 8) -
                                                                         (0xff < uVar27),
                                                                         (uVar18 != 0) *
                                                                         (uVar18 < 0x100) *
                                                                         (char)(uVar17 >> 8) -
                                                                         (0xff < uVar18))))))));
    uVar15 = sVar11 + local_1e08 * 0x41 + 0x80;
    uVar24 = sVar20 + sStack_1e06 * 0x3d + 0x80;
    uVar32 = sVar28 + sStack_1e04 * 0x39 + 0x80;
    uVar40 = sVar36 + sStack_1e02 * 0x36 + 0x80;
    uVar48 = sVar44 + sStack_1e00 * 0x32 + 0x80;
    uVar56 = sVar52 + sStack_1dfe * 0x2f + 0x80;
    uVar64 = sVar60 + sStack_1dfc * 0x2c + 0x80;
    uVar72 = sVar68 + sStack_1dfa * 0x29 + 0x80;
    uVar16 = uVar15 >> 8;
    uVar25 = uVar24 >> 8;
    uVar33 = uVar32 >> 8;
    uVar41 = uVar40 >> 8;
    uVar49 = uVar48 >> 8;
    uVar57 = uVar56 >> 8;
    uVar65 = uVar64 >> 8;
    uVar73 = uVar72 >> 8;
    uVar17 = sVar12 + local_1e08 * 0x26 + 0x80;
    uVar26 = sVar21 + sStack_1e06 * 0x23 + 0x80;
    uVar34 = sVar29 + sStack_1e04 * 0x20 + 0x80;
    uVar42 = sVar37 + sStack_1e02 * 0x1d + 0x80;
    uVar50 = sVar45 + sStack_1e00 * 0x1b + 0x80;
    uVar58 = sVar53 + sStack_1dfe * 0x19 + 0x80;
    uVar66 = sVar61 + sStack_1dfc * 0x16 + 0x80;
    uVar74 = sVar69 + sStack_1dfa * 0x14 + 0x80;
    uVar18 = uVar17 >> 8;
    uVar27 = uVar26 >> 8;
    uVar35 = uVar34 >> 8;
    uVar43 = uVar42 >> 8;
    uVar51 = uVar50 >> 8;
    uVar59 = uVar58 >> 8;
    uVar67 = uVar66 >> 8;
    uVar75 = uVar74 >> 8;
    local_2b48[4] =
         CONCAT17((uVar73 != 0) * (uVar73 < 0x100) * (char)(uVar72 >> 8) - (0xff < uVar73),
                  CONCAT16((uVar65 != 0) * (uVar65 < 0x100) * (char)(uVar64 >> 8) - (0xff < uVar65),
                           CONCAT15((uVar57 != 0) * (uVar57 < 0x100) * (char)(uVar56 >> 8) -
                                    (0xff < uVar57),
                                    CONCAT14((uVar49 != 0) * (uVar49 < 0x100) * (char)(uVar48 >> 8)
                                             - (0xff < uVar49),
                                             CONCAT13((uVar41 != 0) * (uVar41 < 0x100) *
                                                      (char)(uVar40 >> 8) - (0xff < uVar41),
                                                      CONCAT12((uVar33 != 0) * (uVar33 < 0x100) *
                                                               (char)(uVar32 >> 8) - (0xff < uVar33)
                                                               ,CONCAT11((uVar25 != 0) *
                                                                         (uVar25 < 0x100) *
                                                                         (char)(uVar24 >> 8) -
                                                                         (0xff < uVar25),
                                                                         (uVar16 != 0) *
                                                                         (uVar16 < 0x100) *
                                                                         (char)(uVar15 >> 8) -
                                                                         (0xff < uVar16))))))));
    local_2b48[5] =
         CONCAT17((uVar75 != 0) * (uVar75 < 0x100) * (char)(uVar74 >> 8) - (0xff < uVar75),
                  CONCAT16((uVar67 != 0) * (uVar67 < 0x100) * (char)(uVar66 >> 8) - (0xff < uVar67),
                           CONCAT15((uVar59 != 0) * (uVar59 < 0x100) * (char)(uVar58 >> 8) -
                                    (0xff < uVar59),
                                    CONCAT14((uVar51 != 0) * (uVar51 < 0x100) * (char)(uVar50 >> 8)
                                             - (0xff < uVar51),
                                             CONCAT13((uVar43 != 0) * (uVar43 < 0x100) *
                                                      (char)(uVar42 >> 8) - (0xff < uVar43),
                                                      CONCAT12((uVar35 != 0) * (uVar35 < 0x100) *
                                                               (char)(uVar34 >> 8) - (0xff < uVar35)
                                                               ,CONCAT11((uVar27 != 0) *
                                                                         (uVar27 < 0x100) *
                                                                         (char)(uVar26 >> 8) -
                                                                         (0xff < uVar27),
                                                                         (uVar18 != 0) *
                                                                         (uVar18 < 0x100) *
                                                                         (char)(uVar17 >> 8) -
                                                                         (0xff < uVar18))))))));
    uVar15 = sVar13 + local_1e08 * 0x12 + 0x80;
    uVar24 = sVar22 + sStack_1e06 * 0x10 + 0x80;
    uVar32 = sVar30 + sStack_1e04 * 0xf + 0x80;
    uVar40 = sVar38 + sStack_1e02 * 0xd + 0x80;
    uVar48 = sVar46 + sStack_1e00 * 0xc + 0x80;
    uVar56 = sVar54 + sStack_1dfe * 10 + 0x80;
    uVar64 = sVar62 + sStack_1dfc * 9 + 0x80;
    uVar72 = sVar70 + sStack_1dfa * 8 + 0x80;
    uVar16 = uVar15 >> 8;
    uVar25 = uVar24 >> 8;
    uVar33 = uVar32 >> 8;
    uVar41 = uVar40 >> 8;
    uVar49 = uVar48 >> 8;
    uVar57 = uVar56 >> 8;
    uVar65 = uVar64 >> 8;
    uVar73 = uVar72 >> 8;
    uVar17 = sVar14 + local_1e08 * 7 + 0x80;
    uVar26 = sVar23 + sStack_1e06 * 6 + 0x80;
    uVar34 = sVar31 + sStack_1e04 * 6 + 0x80;
    uVar42 = sVar39 + sStack_1e02 * 5 + 0x80;
    uVar50 = sVar47 + sStack_1e00 * 5 + 0x80;
    uVar58 = sVar55 + sStack_1dfe * 4 + 0x80;
    uVar66 = sVar63 + sStack_1dfc * 4 + 0x80;
    uVar74 = sVar71 + sStack_1dfa * 4 + 0x80;
    uVar18 = uVar17 >> 8;
    uVar27 = uVar26 >> 8;
    uVar35 = uVar34 >> 8;
    uVar43 = uVar42 >> 8;
    uVar51 = uVar50 >> 8;
    uVar59 = uVar58 >> 8;
    uVar67 = uVar66 >> 8;
    uVar75 = uVar74 >> 8;
    local_2b48[6] =
         CONCAT17((uVar73 != 0) * (uVar73 < 0x100) * (char)(uVar72 >> 8) - (0xff < uVar73),
                  CONCAT16((uVar65 != 0) * (uVar65 < 0x100) * (char)(uVar64 >> 8) - (0xff < uVar65),
                           CONCAT15((uVar57 != 0) * (uVar57 < 0x100) * (char)(uVar56 >> 8) -
                                    (0xff < uVar57),
                                    CONCAT14((uVar49 != 0) * (uVar49 < 0x100) * (char)(uVar48 >> 8)
                                             - (0xff < uVar49),
                                             CONCAT13((uVar41 != 0) * (uVar41 < 0x100) *
                                                      (char)(uVar40 >> 8) - (0xff < uVar41),
                                                      CONCAT12((uVar33 != 0) * (uVar33 < 0x100) *
                                                               (char)(uVar32 >> 8) - (0xff < uVar33)
                                                               ,CONCAT11((uVar25 != 0) *
                                                                         (uVar25 < 0x100) *
                                                                         (char)(uVar24 >> 8) -
                                                                         (0xff < uVar25),
                                                                         (uVar16 != 0) *
                                                                         (uVar16 < 0x100) *
                                                                         (char)(uVar15 >> 8) -
                                                                         (0xff < uVar16))))))));
    local_2b48[7] =
         CONCAT17((uVar75 != 0) * (uVar75 < 0x100) * (char)(uVar74 >> 8) - (0xff < uVar75),
                  CONCAT16((uVar67 != 0) * (uVar67 < 0x100) * (char)(uVar66 >> 8) - (0xff < uVar67),
                           CONCAT15((uVar59 != 0) * (uVar59 < 0x100) * (char)(uVar58 >> 8) -
                                    (0xff < uVar59),
                                    CONCAT14((uVar51 != 0) * (uVar51 < 0x100) * (char)(uVar50 >> 8)
                                             - (0xff < uVar51),
                                             CONCAT13((uVar43 != 0) * (uVar43 < 0x100) *
                                                      (char)(uVar42 >> 8) - (0xff < uVar43),
                                                      CONCAT12((uVar35 != 0) * (uVar35 < 0x100) *
                                                               (char)(uVar34 >> 8) - (0xff < uVar35)
                                                               ,CONCAT11((uVar27 != 0) *
                                                                         (uVar27 < 0x100) *
                                                                         (char)(uVar26 >> 8) -
                                                                         (0xff < uVar27),
                                                                         (uVar18 != 0) *
                                                                         (uVar18 < 0x100) *
                                                                         (char)(uVar17 >> 8) -
                                                                         (0xff < uVar18))))))));
    local_2b48 = (undefined8 *)(in_RSI + (long)local_2b48);
  }
  return;
}

Assistant:

void aom_smooth_h_predictor_64x32_ssse3(
    uint8_t *LIBAOM_RESTRICT dst, ptrdiff_t stride,
    const uint8_t *LIBAOM_RESTRICT top_row,
    const uint8_t *LIBAOM_RESTRICT left_column) {
  const __m128i top_right = _mm_set1_epi16(top_row[63]);
  const __m128i left1 = cvtepu8_epi16(LoadLo8(left_column));
  const __m128i weights_lolo = LoadUnaligned16(smooth_weights + 60);
  const __m128i weights_lohi = LoadUnaligned16(smooth_weights + 76);
  const __m128i scale = _mm_set1_epi16(1 << SMOOTH_WEIGHT_LOG2_SCALE);
  const __m128i weights1 = cvtepu8_epi16(weights_lolo);
  const __m128i weights2 = cvtepu8_epi16(_mm_srli_si128(weights_lolo, 8));
  const __m128i weights3 = cvtepu8_epi16(weights_lohi);
  const __m128i weights4 = cvtepu8_epi16(_mm_srli_si128(weights_lohi, 8));
  const __m128i inverted_weights1 = _mm_sub_epi16(scale, weights1);
  const __m128i inverted_weights2 = _mm_sub_epi16(scale, weights2);
  const __m128i inverted_weights3 = _mm_sub_epi16(scale, weights3);
  const __m128i inverted_weights4 = _mm_sub_epi16(scale, weights4);
  const __m128i scaled_top_right1 =
      _mm_mullo_epi16(inverted_weights1, top_right);
  const __m128i scaled_top_right2 =
      _mm_mullo_epi16(inverted_weights2, top_right);
  const __m128i scaled_top_right3 =
      _mm_mullo_epi16(inverted_weights3, top_right);
  const __m128i scaled_top_right4 =
      _mm_mullo_epi16(inverted_weights4, top_right);
  const __m128i weights_hilo = LoadUnaligned16(smooth_weights + 92);
  const __m128i weights_hihi = LoadUnaligned16(smooth_weights + 108);
  const __m128i weights5 = cvtepu8_epi16(weights_hilo);
  const __m128i weights6 = cvtepu8_epi16(_mm_srli_si128(weights_hilo, 8));
  const __m128i weights7 = cvtepu8_epi16(weights_hihi);
  const __m128i weights8 = cvtepu8_epi16(_mm_srli_si128(weights_hihi, 8));
  const __m128i inverted_weights5 = _mm_sub_epi16(scale, weights5);
  const __m128i inverted_weights6 = _mm_sub_epi16(scale, weights6);
  const __m128i inverted_weights7 = _mm_sub_epi16(scale, weights7);
  const __m128i inverted_weights8 = _mm_sub_epi16(scale, weights8);
  const __m128i scaled_top_right5 =
      _mm_mullo_epi16(inverted_weights5, top_right);
  const __m128i scaled_top_right6 =
      _mm_mullo_epi16(inverted_weights6, top_right);
  const __m128i scaled_top_right7 =
      _mm_mullo_epi16(inverted_weights7, top_right);
  const __m128i scaled_top_right8 =
      _mm_mullo_epi16(inverted_weights8, top_right);
  const __m128i round = _mm_set1_epi16(1 << (SMOOTH_WEIGHT_LOG2_SCALE - 1));
  for (int y_mask = 0x01000100; y_mask < 0x0F0E0F0F; y_mask += 0x02020202) {
    const __m128i y_select = _mm_set1_epi32(y_mask);
    const __m128i left_y = _mm_shuffle_epi8(left1, y_select);
    write_smooth_directional_sum16(dst, left_y, left_y, weights1, weights2,
                                   scaled_top_right1, scaled_top_right2, round);
    write_smooth_directional_sum16(dst + 16, left_y, left_y, weights3, weights4,
                                   scaled_top_right3, scaled_top_right4, round);
    write_smooth_directional_sum16(dst + 32, left_y, left_y, weights5, weights6,
                                   scaled_top_right5, scaled_top_right6, round);
    write_smooth_directional_sum16(dst + 48, left_y, left_y, weights7, weights8,
                                   scaled_top_right7, scaled_top_right8, round);
    dst += stride;
  }
  const __m128i left2 = cvtepu8_epi16(LoadLo8(left_column + 8));
  for (int y_mask = 0x01000100; y_mask < 0x0F0E0F0F; y_mask += 0x02020202) {
    const __m128i y_select = _mm_set1_epi32(y_mask);
    const __m128i left_y = _mm_shuffle_epi8(left2, y_select);
    write_smooth_directional_sum16(dst, left_y, left_y, weights1, weights2,
                                   scaled_top_right1, scaled_top_right2, round);
    write_smooth_directional_sum16(dst + 16, left_y, left_y, weights3, weights4,
                                   scaled_top_right3, scaled_top_right4, round);
    write_smooth_directional_sum16(dst + 32, left_y, left_y, weights5, weights6,
                                   scaled_top_right5, scaled_top_right6, round);
    write_smooth_directional_sum16(dst + 48, left_y, left_y, weights7, weights8,
                                   scaled_top_right7, scaled_top_right8, round);
    dst += stride;
  }
  const __m128i left3 = cvtepu8_epi16(LoadLo8(left_column + 16));
  for (int y_mask = 0x01000100; y_mask < 0x0F0E0F0F; y_mask += 0x02020202) {
    const __m128i y_select = _mm_set1_epi32(y_mask);
    const __m128i left_y = _mm_shuffle_epi8(left3, y_select);
    write_smooth_directional_sum16(dst, left_y, left_y, weights1, weights2,
                                   scaled_top_right1, scaled_top_right2, round);
    write_smooth_directional_sum16(dst + 16, left_y, left_y, weights3, weights4,
                                   scaled_top_right3, scaled_top_right4, round);
    write_smooth_directional_sum16(dst + 32, left_y, left_y, weights5, weights6,
                                   scaled_top_right5, scaled_top_right6, round);
    write_smooth_directional_sum16(dst + 48, left_y, left_y, weights7, weights8,
                                   scaled_top_right7, scaled_top_right8, round);
    dst += stride;
  }
  const __m128i left4 = cvtepu8_epi16(LoadLo8(left_column + 24));
  for (int y_mask = 0x01000100; y_mask < 0x0F0E0F0F; y_mask += 0x02020202) {
    const __m128i y_select = _mm_set1_epi32(y_mask);
    const __m128i left_y = _mm_shuffle_epi8(left4, y_select);
    write_smooth_directional_sum16(dst, left_y, left_y, weights1, weights2,
                                   scaled_top_right1, scaled_top_right2, round);
    write_smooth_directional_sum16(dst + 16, left_y, left_y, weights3, weights4,
                                   scaled_top_right3, scaled_top_right4, round);
    write_smooth_directional_sum16(dst + 32, left_y, left_y, weights5, weights6,
                                   scaled_top_right5, scaled_top_right6, round);
    write_smooth_directional_sum16(dst + 48, left_y, left_y, weights7, weights8,
                                   scaled_top_right7, scaled_top_right8, round);
    dst += stride;
  }
}